

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersector1<8>::
     intersect_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  long lVar67;
  ulong uVar68;
  ulong uVar69;
  float t1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar114 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar167;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar165;
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar168;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar172;
  float fVar189;
  float fVar190;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [32];
  float fVar191;
  undefined1 auVar188 [32];
  float fVar195;
  float fVar209;
  float fVar211;
  vfloat4 b0;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar201 [16];
  float fVar214;
  float fVar215;
  float fVar217;
  undefined1 auVar206 [32];
  float fVar212;
  undefined1 auVar207 [32];
  float fVar210;
  float fVar213;
  float fVar216;
  undefined1 auVar208 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar240 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  __m128 a;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar252 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  vfloat4 a0;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar281;
  vfloat4 a0_1;
  undefined1 auVar273 [16];
  float fVar282;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar286;
  float fVar293;
  undefined1 auVar289 [16];
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float in_register_0000151c;
  undefined1 auVar290 [32];
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  float fVar307;
  float fVar308;
  undefined1 auVar306 [32];
  undefined1 auVar310 [16];
  float fVar309;
  undefined1 auVar311 [16];
  float fVar314;
  float fVar315;
  float in_register_0000159c;
  undefined1 auVar312 [32];
  undefined1 auVar313 [64];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float in_register_000015dc;
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4d8 [16];
  int local_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  ulong local_480;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 auStack_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 auStack_448 [16];
  undefined1 local_438 [32];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 auStack_288 [16];
  uint auStack_278 [4];
  undefined8 local_268;
  float local_260;
  undefined8 local_25c;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  float afStack_198 [8];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar66;
  undefined1 auVar147 [32];
  undefined1 auVar321 [32];
  
  PVar8 = prim[1];
  uVar69 = (ulong)(byte)PVar8;
  lVar67 = uVar69 * 5;
  fVar172 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar95 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar173._0_4_ = fVar172 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar173._4_4_ = fVar172 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar173._8_4_ = fVar172 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar173._12_4_ = fVar172 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 10)));
  auVar85._0_4_ = fVar172 * auVar95._0_4_;
  auVar85._4_4_ = fVar172 * auVar95._4_4_;
  auVar85._8_4_ = fVar172 * auVar95._8_4_;
  auVar85._12_4_ = fVar172 * auVar95._12_4_;
  auVar77._16_16_ = auVar177;
  auVar77._0_16_ = auVar96;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar67 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar67 + 10)));
  auVar121._16_16_ = auVar177;
  auVar121._0_16_ = auVar96;
  auVar14 = vcvtdq2ps_avx(auVar121);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 10)));
  auVar140._16_16_ = auVar177;
  auVar140._0_16_ = auVar96;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 10)));
  auVar15 = vcvtdq2ps_avx(auVar140);
  auVar141._16_16_ = auVar177;
  auVar141._0_16_ = auVar96;
  auVar16 = vcvtdq2ps_avx(auVar141);
  uVar68 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar206._16_16_ = auVar177;
  auVar206._0_16_ = auVar96;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar69 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar206);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar69 + 10)));
  auVar227._16_16_ = auVar177;
  auVar227._0_16_ = auVar96;
  lVar13 = uVar69 * 9;
  uVar68 = (ulong)(uint)((int)lVar13 * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar227);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar228._16_16_ = auVar177;
  auVar228._0_16_ = auVar96;
  auVar19 = vcvtdq2ps_avx(auVar228);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar69 + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar69 + 10)));
  auVar261._16_16_ = auVar177;
  auVar261._0_16_ = auVar96;
  uVar68 = (ulong)(uint)((int)lVar67 << 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar261);
  auVar270._16_16_ = auVar177;
  auVar270._0_16_ = auVar96;
  auVar21 = vcvtdq2ps_avx(auVar270);
  auVar96 = vshufps_avx(auVar173,auVar173,0);
  auVar177 = vshufps_avx(auVar173,auVar173,0x55);
  auVar95 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar172 = auVar95._0_4_;
  fVar195 = auVar95._4_4_;
  fVar189 = auVar95._8_4_;
  fVar209 = auVar95._12_4_;
  fVar190 = auVar177._0_4_;
  fVar211 = auVar177._4_4_;
  fVar191 = auVar177._8_4_;
  fVar212 = auVar177._12_4_;
  fVar192 = auVar96._0_4_;
  fVar214 = auVar96._4_4_;
  fVar193 = auVar96._8_4_;
  fVar215 = auVar96._12_4_;
  auVar290._0_4_ = fVar192 * auVar77._0_4_ + fVar190 * auVar14._0_4_ + fVar172 * auVar15._0_4_;
  auVar290._4_4_ = fVar214 * auVar77._4_4_ + fVar211 * auVar14._4_4_ + fVar195 * auVar15._4_4_;
  auVar290._8_4_ = fVar193 * auVar77._8_4_ + fVar191 * auVar14._8_4_ + fVar189 * auVar15._8_4_;
  auVar290._12_4_ = fVar215 * auVar77._12_4_ + fVar212 * auVar14._12_4_ + fVar209 * auVar15._12_4_;
  auVar290._16_4_ = fVar192 * auVar77._16_4_ + fVar190 * auVar14._16_4_ + fVar172 * auVar15._16_4_;
  auVar290._20_4_ = fVar214 * auVar77._20_4_ + fVar211 * auVar14._20_4_ + fVar195 * auVar15._20_4_;
  auVar290._24_4_ = fVar193 * auVar77._24_4_ + fVar191 * auVar14._24_4_ + fVar189 * auVar15._24_4_;
  auVar290._28_4_ = fVar212 + in_register_000015dc + in_register_0000151c;
  auVar279._0_4_ = fVar192 * auVar16._0_4_ + fVar190 * auVar17._0_4_ + auVar18._0_4_ * fVar172;
  auVar279._4_4_ = fVar214 * auVar16._4_4_ + fVar211 * auVar17._4_4_ + auVar18._4_4_ * fVar195;
  auVar279._8_4_ = fVar193 * auVar16._8_4_ + fVar191 * auVar17._8_4_ + auVar18._8_4_ * fVar189;
  auVar279._12_4_ = fVar215 * auVar16._12_4_ + fVar212 * auVar17._12_4_ + auVar18._12_4_ * fVar209;
  auVar279._16_4_ = fVar192 * auVar16._16_4_ + fVar190 * auVar17._16_4_ + auVar18._16_4_ * fVar172;
  auVar279._20_4_ = fVar214 * auVar16._20_4_ + fVar211 * auVar17._20_4_ + auVar18._20_4_ * fVar195;
  auVar279._24_4_ = fVar193 * auVar16._24_4_ + fVar191 * auVar17._24_4_ + auVar18._24_4_ * fVar189;
  auVar279._28_4_ = fVar212 + in_register_000015dc + in_register_0000159c;
  auVar187._0_4_ = fVar192 * auVar19._0_4_ + fVar190 * auVar20._0_4_ + auVar21._0_4_ * fVar172;
  auVar187._4_4_ = fVar214 * auVar19._4_4_ + fVar211 * auVar20._4_4_ + auVar21._4_4_ * fVar195;
  auVar187._8_4_ = fVar193 * auVar19._8_4_ + fVar191 * auVar20._8_4_ + auVar21._8_4_ * fVar189;
  auVar187._12_4_ = fVar215 * auVar19._12_4_ + fVar212 * auVar20._12_4_ + auVar21._12_4_ * fVar209;
  auVar187._16_4_ = fVar192 * auVar19._16_4_ + fVar190 * auVar20._16_4_ + auVar21._16_4_ * fVar172;
  auVar187._20_4_ = fVar214 * auVar19._20_4_ + fVar211 * auVar20._20_4_ + auVar21._20_4_ * fVar195;
  auVar187._24_4_ = fVar193 * auVar19._24_4_ + fVar191 * auVar20._24_4_ + auVar21._24_4_ * fVar189;
  auVar187._28_4_ = fVar215 + fVar212 + fVar209;
  auVar96 = vshufps_avx(auVar85,auVar85,0);
  auVar177 = vshufps_avx(auVar85,auVar85,0x55);
  auVar95 = vshufps_avx(auVar85,auVar85,0xaa);
  fVar195 = auVar95._0_4_;
  fVar189 = auVar95._4_4_;
  fVar209 = auVar95._8_4_;
  fVar190 = auVar95._12_4_;
  fVar214 = auVar177._0_4_;
  fVar193 = auVar177._4_4_;
  fVar215 = auVar177._8_4_;
  fVar194 = auVar177._12_4_;
  fVar211 = auVar96._0_4_;
  fVar191 = auVar96._4_4_;
  fVar212 = auVar96._8_4_;
  fVar192 = auVar96._12_4_;
  fVar172 = auVar77._28_4_;
  auVar106._0_4_ = fVar211 * auVar77._0_4_ + fVar214 * auVar14._0_4_ + fVar195 * auVar15._0_4_;
  auVar106._4_4_ = fVar191 * auVar77._4_4_ + fVar193 * auVar14._4_4_ + fVar189 * auVar15._4_4_;
  auVar106._8_4_ = fVar212 * auVar77._8_4_ + fVar215 * auVar14._8_4_ + fVar209 * auVar15._8_4_;
  auVar106._12_4_ = fVar192 * auVar77._12_4_ + fVar194 * auVar14._12_4_ + fVar190 * auVar15._12_4_;
  auVar106._16_4_ = fVar211 * auVar77._16_4_ + fVar214 * auVar14._16_4_ + fVar195 * auVar15._16_4_;
  auVar106._20_4_ = fVar191 * auVar77._20_4_ + fVar193 * auVar14._20_4_ + fVar189 * auVar15._20_4_;
  auVar106._24_4_ = fVar212 * auVar77._24_4_ + fVar215 * auVar14._24_4_ + fVar209 * auVar15._24_4_;
  auVar106._28_4_ = fVar172 + auVar14._28_4_ + auVar15._28_4_;
  auVar122._0_4_ = fVar211 * auVar16._0_4_ + auVar18._0_4_ * fVar195 + fVar214 * auVar17._0_4_;
  auVar122._4_4_ = fVar191 * auVar16._4_4_ + auVar18._4_4_ * fVar189 + fVar193 * auVar17._4_4_;
  auVar122._8_4_ = fVar212 * auVar16._8_4_ + auVar18._8_4_ * fVar209 + fVar215 * auVar17._8_4_;
  auVar122._12_4_ = fVar192 * auVar16._12_4_ + auVar18._12_4_ * fVar190 + fVar194 * auVar17._12_4_;
  auVar122._16_4_ = fVar211 * auVar16._16_4_ + auVar18._16_4_ * fVar195 + fVar214 * auVar17._16_4_;
  auVar122._20_4_ = fVar191 * auVar16._20_4_ + auVar18._20_4_ * fVar189 + fVar193 * auVar17._20_4_;
  auVar122._24_4_ = fVar212 * auVar16._24_4_ + auVar18._24_4_ * fVar209 + fVar215 * auVar17._24_4_;
  auVar122._28_4_ = fVar172 + auVar18._28_4_ + auVar15._28_4_;
  auVar142._8_4_ = 0x7fffffff;
  auVar142._0_8_ = 0x7fffffff7fffffff;
  auVar142._12_4_ = 0x7fffffff;
  auVar142._16_4_ = 0x7fffffff;
  auVar142._20_4_ = 0x7fffffff;
  auVar142._24_4_ = 0x7fffffff;
  auVar142._28_4_ = 0x7fffffff;
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar161._16_4_ = 0x219392ef;
  auVar161._20_4_ = 0x219392ef;
  auVar161._24_4_ = 0x219392ef;
  auVar161._28_4_ = 0x219392ef;
  auVar77 = vandps_avx(auVar290,auVar142);
  auVar77 = vcmpps_avx(auVar77,auVar161,1);
  auVar14 = vblendvps_avx(auVar290,auVar161,auVar77);
  auVar77 = vandps_avx(auVar279,auVar142);
  auVar77 = vcmpps_avx(auVar77,auVar161,1);
  auVar15 = vblendvps_avx(auVar279,auVar161,auVar77);
  auVar77 = vandps_avx(auVar187,auVar142);
  auVar77 = vcmpps_avx(auVar77,auVar161,1);
  auVar77 = vblendvps_avx(auVar187,auVar161,auVar77);
  auVar143._0_4_ = fVar211 * auVar19._0_4_ + fVar214 * auVar20._0_4_ + auVar21._0_4_ * fVar195;
  auVar143._4_4_ = fVar191 * auVar19._4_4_ + fVar193 * auVar20._4_4_ + auVar21._4_4_ * fVar189;
  auVar143._8_4_ = fVar212 * auVar19._8_4_ + fVar215 * auVar20._8_4_ + auVar21._8_4_ * fVar209;
  auVar143._12_4_ = fVar192 * auVar19._12_4_ + fVar194 * auVar20._12_4_ + auVar21._12_4_ * fVar190;
  auVar143._16_4_ = fVar211 * auVar19._16_4_ + fVar214 * auVar20._16_4_ + auVar21._16_4_ * fVar195;
  auVar143._20_4_ = fVar191 * auVar19._20_4_ + fVar193 * auVar20._20_4_ + auVar21._20_4_ * fVar189;
  auVar143._24_4_ = fVar212 * auVar19._24_4_ + fVar215 * auVar20._24_4_ + auVar21._24_4_ * fVar209;
  auVar143._28_4_ = fVar172 + auVar17._28_4_ + fVar190;
  auVar16 = vrcpps_avx(auVar14);
  fVar172 = auVar16._0_4_;
  fVar189 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar189;
  auVar17._0_4_ = auVar14._0_4_ * fVar172;
  fVar190 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar190;
  fVar191 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar191;
  fVar192 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar192;
  fVar193 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar193;
  fVar194 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar194;
  auVar17._28_4_ = auVar187._28_4_;
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = &DAT_3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar229,auVar17);
  auVar14 = vrcpps_avx(auVar15);
  fVar172 = fVar172 + fVar172 * auVar17._0_4_;
  fVar189 = fVar189 + fVar189 * auVar17._4_4_;
  fVar190 = fVar190 + fVar190 * auVar17._8_4_;
  fVar191 = fVar191 + fVar191 * auVar17._12_4_;
  fVar192 = fVar192 + fVar192 * auVar17._16_4_;
  fVar193 = fVar193 + fVar193 * auVar17._20_4_;
  fVar194 = fVar194 + fVar194 * auVar17._24_4_;
  fVar195 = auVar14._0_4_;
  fVar209 = auVar14._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar209;
  auVar18._0_4_ = auVar15._0_4_ * fVar195;
  fVar211 = auVar14._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar211;
  fVar212 = auVar14._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar212;
  fVar214 = auVar14._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar214;
  fVar215 = auVar14._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar215;
  fVar217 = auVar14._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar217;
  auVar18._28_4_ = auVar16._28_4_;
  auVar14 = vsubps_avx(auVar229,auVar18);
  fVar195 = fVar195 + fVar195 * auVar14._0_4_;
  fVar209 = fVar209 + fVar209 * auVar14._4_4_;
  fVar211 = fVar211 + fVar211 * auVar14._8_4_;
  fVar212 = fVar212 + fVar212 * auVar14._12_4_;
  fVar214 = fVar214 + fVar214 * auVar14._16_4_;
  fVar215 = fVar215 + fVar215 * auVar14._20_4_;
  fVar217 = fVar217 + fVar217 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar77);
  fVar149 = auVar14._0_4_;
  fVar165 = auVar14._4_4_;
  auVar15._4_4_ = fVar165 * auVar77._4_4_;
  auVar15._0_4_ = fVar149 * auVar77._0_4_;
  fVar166 = auVar14._8_4_;
  auVar15._8_4_ = fVar166 * auVar77._8_4_;
  fVar167 = auVar14._12_4_;
  auVar15._12_4_ = fVar167 * auVar77._12_4_;
  fVar169 = auVar14._16_4_;
  auVar15._16_4_ = fVar169 * auVar77._16_4_;
  fVar170 = auVar14._20_4_;
  auVar15._20_4_ = fVar170 * auVar77._20_4_;
  fVar171 = auVar14._24_4_;
  auVar15._24_4_ = fVar171 * auVar77._24_4_;
  auVar15._28_4_ = auVar77._28_4_;
  auVar77 = vsubps_avx(auVar229,auVar15);
  fVar149 = fVar149 + fVar149 * auVar77._0_4_;
  fVar165 = fVar165 + fVar165 * auVar77._4_4_;
  fVar166 = fVar166 + fVar166 * auVar77._8_4_;
  fVar167 = fVar167 + fVar167 * auVar77._12_4_;
  fVar169 = fVar169 + fVar169 * auVar77._16_4_;
  fVar170 = fVar170 + fVar170 * auVar77._20_4_;
  fVar171 = fVar171 + fVar171 * auVar77._24_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar69 * 7 + 0xe);
  auVar177 = vpmovsxwd_avx(auVar177);
  auVar78._16_16_ = auVar177;
  auVar78._0_16_ = auVar96;
  auVar77 = vcvtdq2ps_avx(auVar78);
  auVar77 = vsubps_avx(auVar77,auVar106);
  auVar70._0_4_ = fVar172 * auVar77._0_4_;
  auVar70._4_4_ = fVar189 * auVar77._4_4_;
  auVar70._8_4_ = fVar190 * auVar77._8_4_;
  auVar70._12_4_ = fVar191 * auVar77._12_4_;
  auVar16._16_4_ = fVar192 * auVar77._16_4_;
  auVar16._0_16_ = auVar70;
  auVar16._20_4_ = fVar193 * auVar77._20_4_;
  auVar16._24_4_ = fVar194 * auVar77._24_4_;
  auVar16._28_4_ = auVar77._28_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + lVar13 + 6);
  auVar96 = vpmovsxwd_avx(auVar95);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + lVar13 + 0xe);
  auVar177 = vpmovsxwd_avx(auVar136);
  auVar230._16_16_ = auVar177;
  auVar230._0_16_ = auVar96;
  auVar77 = vcvtdq2ps_avx(auVar230);
  auVar77 = vsubps_avx(auVar77,auVar106);
  auVar86._0_4_ = fVar172 * auVar77._0_4_;
  auVar86._4_4_ = fVar189 * auVar77._4_4_;
  auVar86._8_4_ = fVar190 * auVar77._8_4_;
  auVar86._12_4_ = fVar191 * auVar77._12_4_;
  auVar19._16_4_ = fVar192 * auVar77._16_4_;
  auVar19._0_16_ = auVar86;
  auVar19._20_4_ = fVar193 * auVar77._20_4_;
  auVar19._24_4_ = fVar194 * auVar77._24_4_;
  auVar19._28_4_ = auVar77._28_4_;
  lVar67 = (ulong)(byte)PVar8 * 0x10;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + lVar67 + 6);
  auVar96 = vpmovsxwd_avx(auVar103);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + lVar67 + 0xe);
  auVar177 = vpmovsxwd_avx(auVar94);
  lVar67 = lVar67 + uVar69 * -2;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + lVar67 + 6);
  auVar95 = vpmovsxwd_avx(auVar75);
  auVar310._8_8_ = 0;
  auVar310._0_8_ = *(ulong *)(prim + lVar67 + 0xe);
  auVar136 = vpmovsxwd_avx(auVar310);
  auVar188._16_16_ = auVar136;
  auVar188._0_16_ = auVar95;
  auVar77 = vcvtdq2ps_avx(auVar188);
  auVar77 = vsubps_avx(auVar77,auVar122);
  auVar174._0_4_ = fVar195 * auVar77._0_4_;
  auVar174._4_4_ = fVar209 * auVar77._4_4_;
  auVar174._8_4_ = fVar211 * auVar77._8_4_;
  auVar174._12_4_ = fVar212 * auVar77._12_4_;
  auVar20._16_4_ = fVar214 * auVar77._16_4_;
  auVar20._0_16_ = auVar174;
  auVar20._20_4_ = fVar215 * auVar77._20_4_;
  auVar20._24_4_ = fVar217 * auVar77._24_4_;
  auVar20._28_4_ = auVar77._28_4_;
  auVar231._16_16_ = auVar177;
  auVar231._0_16_ = auVar96;
  auVar77 = vcvtdq2ps_avx(auVar231);
  auVar77 = vsubps_avx(auVar77,auVar122);
  auVar112._0_4_ = fVar195 * auVar77._0_4_;
  auVar112._4_4_ = fVar209 * auVar77._4_4_;
  auVar112._8_4_ = fVar211 * auVar77._8_4_;
  auVar112._12_4_ = fVar212 * auVar77._12_4_;
  auVar21._16_4_ = fVar214 * auVar77._16_4_;
  auVar21._0_16_ = auVar112;
  auVar21._20_4_ = fVar215 * auVar77._20_4_;
  auVar21._24_4_ = fVar217 * auVar77._24_4_;
  auVar21._28_4_ = auVar77._28_4_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar68 + uVar69 + 6);
  auVar96 = vpmovsxwd_avx(auVar148);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar68 + uVar69 + 0xe);
  auVar177 = vpmovsxwd_avx(auVar6);
  auVar207._16_16_ = auVar177;
  auVar207._0_16_ = auVar96;
  auVar77 = vcvtdq2ps_avx(auVar207);
  auVar77 = vsubps_avx(auVar77,auVar143);
  auVar196._0_4_ = fVar149 * auVar77._0_4_;
  auVar196._4_4_ = fVar165 * auVar77._4_4_;
  auVar196._8_4_ = fVar166 * auVar77._8_4_;
  auVar196._12_4_ = fVar167 * auVar77._12_4_;
  auVar22._16_4_ = fVar169 * auVar77._16_4_;
  auVar22._0_16_ = auVar196;
  auVar22._20_4_ = fVar170 * auVar77._20_4_;
  auVar22._24_4_ = fVar171 * auVar77._24_4_;
  auVar22._28_4_ = auVar77._28_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar7);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 0xe);
  auVar177 = vpmovsxwd_avx(auVar223);
  auVar232._16_16_ = auVar177;
  auVar232._0_16_ = auVar96;
  auVar77 = vcvtdq2ps_avx(auVar232);
  auVar77 = vsubps_avx(auVar77,auVar143);
  auVar127._0_4_ = fVar149 * auVar77._0_4_;
  auVar127._4_4_ = fVar165 * auVar77._4_4_;
  auVar127._8_4_ = fVar166 * auVar77._8_4_;
  auVar127._12_4_ = fVar167 * auVar77._12_4_;
  auVar23._16_4_ = fVar169 * auVar77._16_4_;
  auVar23._0_16_ = auVar127;
  auVar23._20_4_ = fVar170 * auVar77._20_4_;
  auVar23._24_4_ = fVar171 * auVar77._24_4_;
  auVar23._28_4_ = auVar77._28_4_;
  auVar96 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar177 = vpminsd_avx(auVar70,auVar86);
  auVar271._16_16_ = auVar96;
  auVar271._0_16_ = auVar177;
  auVar96 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar177 = vpminsd_avx(auVar174,auVar112);
  auVar280._16_16_ = auVar96;
  auVar280._0_16_ = auVar177;
  auVar77 = vmaxps_avx(auVar271,auVar280);
  auVar96 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar177 = vpminsd_avx(auVar196,auVar127);
  auVar305._16_16_ = auVar96;
  auVar305._0_16_ = auVar177;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar312._4_4_ = uVar2;
  auVar312._0_4_ = uVar2;
  auVar312._8_4_ = uVar2;
  auVar312._12_4_ = uVar2;
  auVar312._16_4_ = uVar2;
  auVar312._20_4_ = uVar2;
  auVar312._24_4_ = uVar2;
  auVar312._28_4_ = uVar2;
  auVar14 = vmaxps_avx(auVar305,auVar312);
  auVar77 = vmaxps_avx(auVar77,auVar14);
  local_178._4_4_ = auVar77._4_4_ * 0.99999964;
  local_178._0_4_ = auVar77._0_4_ * 0.99999964;
  local_178._8_4_ = auVar77._8_4_ * 0.99999964;
  local_178._12_4_ = auVar77._12_4_ * 0.99999964;
  local_178._16_4_ = auVar77._16_4_ * 0.99999964;
  local_178._20_4_ = auVar77._20_4_ * 0.99999964;
  local_178._24_4_ = auVar77._24_4_ * 0.99999964;
  local_178._28_4_ = auVar77._28_4_;
  auVar96 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar177 = vpmaxsd_avx(auVar70,auVar86);
  auVar79._16_16_ = auVar96;
  auVar79._0_16_ = auVar177;
  auVar96 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar177 = vpmaxsd_avx(auVar174,auVar112);
  auVar107._16_16_ = auVar96;
  auVar107._0_16_ = auVar177;
  auVar77 = vminps_avx(auVar79,auVar107);
  auVar96 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar177 = vpmaxsd_avx(auVar196,auVar127);
  auVar108._16_16_ = auVar96;
  auVar108._0_16_ = auVar177;
  fVar172 = (ray->super_RayK<1>).tfar;
  auVar123._4_4_ = fVar172;
  auVar123._0_4_ = fVar172;
  auVar123._8_4_ = fVar172;
  auVar123._12_4_ = fVar172;
  auVar123._16_4_ = fVar172;
  auVar123._20_4_ = fVar172;
  auVar123._24_4_ = fVar172;
  auVar123._28_4_ = fVar172;
  auVar14 = vminps_avx(auVar108,auVar123);
  auVar77 = vminps_avx(auVar77,auVar14);
  auVar14._4_4_ = auVar77._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar77._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar77._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar77._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar77._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar77._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar77._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar77._28_4_;
  auVar77 = vcmpps_avx(local_178,auVar14,2);
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar109._16_16_ = auVar96;
  auVar109._0_16_ = auVar96;
  auVar14 = vcvtdq2ps_avx(auVar109);
  auVar14 = vcmpps_avx(_DAT_02020f40,auVar14,1);
  auVar77 = vandps_avx(auVar77,auVar14);
  uVar63 = vmovmskps_avx(auVar77);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  auVar80._16_16_ = mm_lookupmask_ps._240_16_;
  auVar80._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,0x80);
  auVar313 = ZEXT1664((undefined1  [16])0x0);
LAB_01108e21:
  uVar69 = (ulong)uVar63;
  lVar67 = 0;
  if (uVar69 != 0) {
    for (; (uVar63 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar63 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar63].ptr;
  local_480 = (ulong)*(uint *)(prim + lVar67 * 4 + 6);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar67 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar68 * (long)pvVar11);
  fVar172 = *pfVar1;
  fVar195 = pfVar1[1];
  fVar189 = pfVar1[2];
  fVar209 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar68 + 1) * (long)pvVar11);
  fVar190 = *pfVar1;
  fVar211 = pfVar1[1];
  fVar191 = pfVar1[2];
  fVar212 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar68 + 2) * (long)pvVar11);
  fVar192 = *pfVar1;
  fVar214 = pfVar1[1];
  fVar193 = pfVar1[2];
  fVar215 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar68 + 3));
  fVar194 = *pfVar1;
  fVar217 = pfVar1[1];
  fVar149 = pfVar1[2];
  fVar165 = pfVar1[3];
  uVar69 = uVar69 - 1 & uVar69;
  lVar67 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar67 + (long)p_Var10 * uVar68);
  fVar166 = *pfVar1;
  fVar167 = pfVar1[1];
  fVar169 = pfVar1[2];
  fVar170 = pfVar1[3];
  pfVar1 = (float *)(lVar67 + (long)p_Var10 * (uVar68 + 1));
  fVar171 = *pfVar1;
  fVar281 = pfVar1[1];
  fVar168 = pfVar1[2];
  fVar282 = pfVar1[3];
  pfVar1 = (float *)(lVar67 + (long)p_Var10 * (uVar68 + 2));
  fVar283 = *pfVar1;
  fVar284 = pfVar1[1];
  fVar285 = pfVar1[2];
  fVar210 = pfVar1[3];
  lVar13 = 0;
  if (uVar69 != 0) {
    for (; (uVar69 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar67 + (long)p_Var10 * (uVar68 + 3));
  fVar286 = *pfVar1;
  fVar213 = pfVar1[1];
  fVar291 = pfVar1[2];
  fVar216 = pfVar1[3];
  if (((uVar69 != 0) && (uVar68 = uVar69 - 1 & uVar69, uVar68 != 0)) && (lVar67 = 0, uVar68 != 0)) {
    for (; (uVar68 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  fVar292 = auVar313._8_4_;
  fVar293 = auVar313._12_4_;
  local_498._0_4_ =
       fVar166 * 0.16666667 + fVar171 * 0.6666667 + fVar283 * 0.16666667 + fVar286 * 0.0;
  local_498._4_4_ =
       fVar167 * 0.16666667 + fVar281 * 0.6666667 + fVar284 * 0.16666667 + fVar213 * 0.0;
  fStack_490 = fVar169 * 0.16666667 + fVar168 * 0.6666667 + fVar285 * 0.16666667 + fVar291 * fVar292
  ;
  fStack_48c = fVar170 * 0.16666667 + fVar282 * 0.6666667 + fVar210 * 0.16666667 + fVar216 * fVar293
  ;
  auVar87._0_4_ = fVar283 * 0.5 + fVar286 * 0.0;
  auVar87._4_4_ = fVar284 * 0.5 + fVar213 * 0.0;
  auVar87._8_4_ = fVar285 * 0.5 + fVar291 * fVar292;
  auVar87._12_4_ = fVar210 * 0.5 + fVar216 * fVar293;
  auVar263._0_4_ = fVar171 * 0.0;
  auVar263._4_4_ = fVar281 * 0.0;
  auVar263._8_4_ = fVar292 * fVar168;
  auVar263._12_4_ = fVar293 * fVar282;
  auVar96 = vsubps_avx(auVar87,auVar263);
  auVar264._0_4_ = fVar166 * 0.5;
  auVar264._4_4_ = fVar167 * 0.5;
  auVar264._8_4_ = fVar169 * 0.5;
  auVar264._12_4_ = fVar170 * 0.5;
  auVar310 = vsubps_avx(auVar96,auVar264);
  auVar265._0_4_ = fVar172 * 0.16666667 + fVar190 * 0.6666667 + fVar192 * 0.16666667 + fVar194 * 0.0
  ;
  auVar265._4_4_ = fVar195 * 0.16666667 + fVar211 * 0.6666667 + fVar214 * 0.16666667 + fVar217 * 0.0
  ;
  auVar265._8_4_ =
       fVar189 * 0.16666667 + fVar191 * 0.6666667 + fVar193 * 0.16666667 + fVar292 * fVar149;
  auVar265._12_4_ =
       fVar209 * 0.16666667 + fVar212 * 0.6666667 + fVar215 * 0.16666667 + fVar293 * fVar165;
  auVar273._0_4_ = fVar192 * 0.5 + fVar194 * 0.0;
  auVar273._4_4_ = fVar214 * 0.5 + fVar217 * 0.0;
  auVar273._8_4_ = fVar193 * 0.5 + fVar292 * fVar149;
  auVar273._12_4_ = fVar215 * 0.5 + fVar293 * fVar165;
  auVar287._0_4_ = fVar190 * 0.0;
  auVar287._4_4_ = fVar211 * 0.0;
  auVar287._8_4_ = fVar292 * fVar191;
  auVar287._12_4_ = fVar293 * fVar212;
  auVar96 = vsubps_avx(auVar273,auVar287);
  auVar288._0_4_ = fVar172 * 0.5;
  auVar288._4_4_ = fVar195 * 0.5;
  auVar288._8_4_ = fVar189 * 0.5;
  auVar288._12_4_ = fVar209 * 0.5;
  auVar136 = vsubps_avx(auVar96,auVar288);
  auVar301._0_4_ = fVar166 * 0.0;
  auVar301._4_4_ = fVar167 * 0.0;
  auVar301._8_4_ = fVar292 * fVar169;
  auVar301._12_4_ = fVar293 * fVar170;
  local_4a8._0_4_ =
       auVar301._0_4_ + fVar171 * 0.16666667 + fVar283 * 0.6666667 + fVar286 * 0.16666667;
  local_4a8._4_4_ =
       auVar301._4_4_ + fVar281 * 0.16666667 + fVar284 * 0.6666667 + fVar213 * 0.16666667;
  fStack_4a0 = auVar301._8_4_ + fVar168 * 0.16666667 + fVar285 * 0.6666667 + fVar291 * 0.16666667;
  fStack_49c = auVar301._12_4_ + fVar282 * 0.16666667 + fVar210 * 0.6666667 + fVar216 * 0.16666667;
  auVar234._0_4_ = fVar283 * 0.0 + fVar286 * 0.5;
  auVar234._4_4_ = fVar284 * 0.0 + fVar213 * 0.5;
  auVar234._8_4_ = fVar285 * fVar292 + fVar291 * 0.5;
  auVar234._12_4_ = fVar210 * fVar293 + fVar216 * 0.5;
  auVar128._0_4_ = fVar171 * 0.5;
  auVar128._4_4_ = fVar281 * 0.5;
  auVar128._8_4_ = fVar168 * 0.5;
  auVar128._12_4_ = fVar282 * 0.5;
  auVar96 = vsubps_avx(auVar234,auVar128);
  auVar148 = vsubps_avx(auVar96,auVar301);
  auVar175._0_4_ = fVar172 * 0.0;
  auVar175._4_4_ = fVar195 * 0.0;
  auVar175._8_4_ = fVar292 * fVar189;
  auVar175._12_4_ = fVar293 * fVar209;
  auVar235._0_4_ =
       fVar190 * 0.16666667 + fVar192 * 0.6666667 + fVar194 * 0.16666667 + auVar175._0_4_;
  auVar235._4_4_ =
       fVar211 * 0.16666667 + fVar214 * 0.6666667 + fVar217 * 0.16666667 + auVar175._4_4_;
  auVar235._8_4_ =
       fVar191 * 0.16666667 + fVar193 * 0.6666667 + fVar149 * 0.16666667 + auVar175._8_4_;
  auVar235._12_4_ =
       fVar212 * 0.16666667 + fVar215 * 0.6666667 + fVar165 * 0.16666667 + auVar175._12_4_;
  auVar197._0_4_ = fVar192 * 0.0 + fVar194 * 0.5;
  auVar197._4_4_ = fVar214 * 0.0 + fVar217 * 0.5;
  auVar197._8_4_ = fVar292 * fVar193 + fVar149 * 0.5;
  auVar197._12_4_ = fVar293 * fVar215 + fVar165 * 0.5;
  auVar150._0_4_ = fVar190 * 0.5;
  auVar150._4_4_ = fVar211 * 0.5;
  auVar150._8_4_ = fVar191 * 0.5;
  auVar150._12_4_ = fVar212 * 0.5;
  auVar96 = vsubps_avx(auVar197,auVar150);
  auVar94 = vsubps_avx(auVar96,auVar175);
  auVar96 = vshufps_avx(auVar310,auVar310,0xc9);
  auVar177 = vshufps_avx(auVar265,auVar265,0xc9);
  fVar194 = auVar310._0_4_;
  auVar198._0_4_ = fVar194 * auVar177._0_4_;
  fVar217 = auVar310._4_4_;
  auVar198._4_4_ = fVar217 * auVar177._4_4_;
  fVar149 = auVar310._8_4_;
  auVar198._8_4_ = fVar149 * auVar177._8_4_;
  fVar165 = auVar310._12_4_;
  auVar198._12_4_ = fVar165 * auVar177._12_4_;
  auVar218._0_4_ = auVar265._0_4_ * auVar96._0_4_;
  auVar218._4_4_ = auVar265._4_4_ * auVar96._4_4_;
  auVar218._8_4_ = auVar265._8_4_ * auVar96._8_4_;
  auVar218._12_4_ = auVar265._12_4_ * auVar96._12_4_;
  auVar177 = vsubps_avx(auVar218,auVar198);
  auVar95 = vshufps_avx(auVar177,auVar177,0xc9);
  auVar177 = vshufps_avx(auVar136,auVar136,0xc9);
  auVar199._0_4_ = fVar194 * auVar177._0_4_;
  auVar199._4_4_ = fVar217 * auVar177._4_4_;
  auVar199._8_4_ = fVar149 * auVar177._8_4_;
  auVar199._12_4_ = fVar165 * auVar177._12_4_;
  auVar151._0_4_ = auVar136._0_4_ * auVar96._0_4_;
  auVar151._4_4_ = auVar136._4_4_ * auVar96._4_4_;
  auVar151._8_4_ = auVar136._8_4_ * auVar96._8_4_;
  auVar151._12_4_ = auVar136._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar151,auVar199);
  auVar136 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar96 = vshufps_avx(auVar148,auVar148,0xc9);
  auVar177 = vshufps_avx(auVar235,auVar235,0xc9);
  fVar166 = auVar148._0_4_;
  auVar152._0_4_ = fVar166 * auVar177._0_4_;
  fVar167 = auVar148._4_4_;
  auVar152._4_4_ = fVar167 * auVar177._4_4_;
  fVar169 = auVar148._8_4_;
  auVar152._8_4_ = fVar169 * auVar177._8_4_;
  fVar170 = auVar148._12_4_;
  auVar152._12_4_ = fVar170 * auVar177._12_4_;
  auVar236._0_4_ = auVar235._0_4_ * auVar96._0_4_;
  auVar236._4_4_ = auVar235._4_4_ * auVar96._4_4_;
  auVar236._8_4_ = auVar235._8_4_ * auVar96._8_4_;
  auVar236._12_4_ = auVar235._12_4_ * auVar96._12_4_;
  auVar177 = vsubps_avx(auVar236,auVar152);
  auVar103 = vshufps_avx(auVar177,auVar177,0xc9);
  auVar177 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar237._0_4_ = auVar177._0_4_ * fVar166;
  auVar237._4_4_ = auVar177._4_4_ * fVar167;
  auVar237._8_4_ = auVar177._8_4_ * fVar169;
  auVar237._12_4_ = auVar177._12_4_ * fVar170;
  auVar176._0_4_ = auVar96._0_4_ * auVar94._0_4_;
  auVar176._4_4_ = auVar96._4_4_ * auVar94._4_4_;
  auVar176._8_4_ = auVar96._8_4_ * auVar94._8_4_;
  auVar176._12_4_ = auVar96._12_4_ * auVar94._12_4_;
  auVar96 = vdpps_avx(auVar95,auVar95,0x7f);
  auVar177 = vsubps_avx(auVar176,auVar237);
  auVar94 = vshufps_avx(auVar177,auVar177,0xc9);
  fVar190 = auVar96._0_4_;
  auVar238._4_12_ = auVar313._4_12_;
  auVar238._0_4_ = fVar190;
  auVar177 = vrsqrtss_avx(auVar238,auVar238);
  fVar172 = auVar177._0_4_;
  auVar177 = ZEXT416((uint)(fVar172 * 1.5 - fVar190 * 0.5 * fVar172 * fVar172 * fVar172));
  auVar75 = vshufps_avx(auVar177,auVar177,0);
  fVar172 = auVar75._0_4_ * auVar95._0_4_;
  fVar195 = auVar75._4_4_ * auVar95._4_4_;
  fVar189 = auVar75._8_4_ * auVar95._8_4_;
  fVar209 = auVar75._12_4_ * auVar95._12_4_;
  auVar177 = vdpps_avx(auVar95,auVar136,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar250._0_4_ = auVar136._0_4_ * auVar96._0_4_;
  auVar250._4_4_ = auVar136._4_4_ * auVar96._4_4_;
  auVar250._8_4_ = auVar136._8_4_ * auVar96._8_4_;
  auVar250._12_4_ = auVar136._12_4_ * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar177,auVar177,0);
  auVar219._0_4_ = auVar96._0_4_ * auVar95._0_4_;
  auVar219._4_4_ = auVar96._4_4_ * auVar95._4_4_;
  auVar219._8_4_ = auVar96._8_4_ * auVar95._8_4_;
  auVar219._12_4_ = auVar96._12_4_ * auVar95._12_4_;
  auVar6 = vsubps_avx(auVar250,auVar219);
  auVar96 = vrcpss_avx(auVar238,auVar238);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar190 * auVar96._0_4_)));
  auVar95 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar103,auVar103,0x7f);
  fVar190 = auVar96._0_4_;
  auVar251._4_12_ = auVar313._4_12_;
  auVar251._0_4_ = fVar190;
  auVar177 = vrsqrtss_avx(auVar251,auVar251);
  fVar211 = auVar177._0_4_;
  auVar177 = vdpps_avx(auVar103,auVar94,0x7f);
  auVar136 = ZEXT416((uint)(fVar211 * 1.5 - fVar190 * 0.5 * fVar211 * fVar211 * fVar211));
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  fVar211 = auVar136._0_4_ * auVar103._0_4_;
  fVar191 = auVar136._4_4_ * auVar103._4_4_;
  fVar212 = auVar136._8_4_ * auVar103._8_4_;
  fVar192 = auVar136._12_4_ * auVar103._12_4_;
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar200._0_4_ = auVar96._0_4_ * auVar94._0_4_;
  auVar200._4_4_ = auVar96._4_4_ * auVar94._4_4_;
  auVar200._8_4_ = auVar96._8_4_ * auVar94._8_4_;
  auVar200._12_4_ = auVar96._12_4_ * auVar94._12_4_;
  auVar96 = vshufps_avx(auVar177,auVar177,0);
  auVar153._0_4_ = auVar96._0_4_ * auVar103._0_4_;
  auVar153._4_4_ = auVar96._4_4_ * auVar103._4_4_;
  auVar153._8_4_ = auVar96._8_4_ * auVar103._8_4_;
  auVar153._12_4_ = auVar96._12_4_ * auVar103._12_4_;
  auVar94 = vsubps_avx(auVar200,auVar153);
  auVar96 = vrcpss_avx(auVar251,auVar251);
  auVar96 = ZEXT416((uint)((2.0 - fVar190 * auVar96._0_4_) * auVar96._0_4_));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar177 = vshufps_avx(_local_498,_local_498,0xff);
  auVar239._0_4_ = auVar177._0_4_ * fVar172;
  auVar239._4_4_ = auVar177._4_4_ * fVar195;
  auVar239._8_4_ = auVar177._8_4_ * fVar189;
  auVar239._12_4_ = auVar177._12_4_ * fVar209;
  _local_398 = vsubps_avx(_local_498,auVar239);
  auVar103 = vshufps_avx(auVar310,auVar310,0xff);
  auVar178._0_4_ =
       auVar103._0_4_ * fVar172 + auVar177._0_4_ * auVar75._0_4_ * auVar95._0_4_ * auVar6._0_4_;
  auVar178._4_4_ =
       auVar103._4_4_ * fVar195 + auVar177._4_4_ * auVar75._4_4_ * auVar95._4_4_ * auVar6._4_4_;
  auVar178._8_4_ =
       auVar103._8_4_ * fVar189 + auVar177._8_4_ * auVar75._8_4_ * auVar95._8_4_ * auVar6._8_4_;
  auVar178._12_4_ =
       auVar103._12_4_ * fVar209 + auVar177._12_4_ * auVar75._12_4_ * auVar95._12_4_ * auVar6._12_4_
  ;
  auVar103 = vsubps_avx(auVar310,auVar178);
  local_3a8._0_4_ = auVar239._0_4_ + (float)local_498._0_4_;
  local_3a8._4_4_ = auVar239._4_4_ + (float)local_498._4_4_;
  fStack_3a0 = auVar239._8_4_ + fStack_490;
  fStack_39c = auVar239._12_4_ + fStack_48c;
  auVar177 = vshufps_avx(_local_4a8,_local_4a8,0xff);
  auVar88._0_4_ = fVar211 * auVar177._0_4_;
  auVar88._4_4_ = fVar191 * auVar177._4_4_;
  auVar88._8_4_ = fVar212 * auVar177._8_4_;
  auVar88._12_4_ = fVar192 * auVar177._12_4_;
  _local_3b8 = vsubps_avx(_local_4a8,auVar88);
  auVar95 = vshufps_avx(auVar148,auVar148,0xff);
  auVar71._0_4_ =
       fVar211 * auVar95._0_4_ + auVar177._0_4_ * auVar136._0_4_ * auVar94._0_4_ * auVar96._0_4_;
  auVar71._4_4_ =
       fVar191 * auVar95._4_4_ + auVar177._4_4_ * auVar136._4_4_ * auVar94._4_4_ * auVar96._4_4_;
  auVar71._8_4_ =
       fVar212 * auVar95._8_4_ + auVar177._8_4_ * auVar136._8_4_ * auVar94._8_4_ * auVar96._8_4_;
  auVar71._12_4_ =
       fVar192 * auVar95._12_4_ +
       auVar177._12_4_ * auVar136._12_4_ * auVar94._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar148,auVar71);
  local_3c8._0_4_ = (float)local_4a8._0_4_ + auVar88._0_4_;
  local_3c8._4_4_ = (float)local_4a8._4_4_ + auVar88._4_4_;
  fStack_3c0 = fStack_4a0 + auVar88._8_4_;
  fStack_3bc = fStack_49c + auVar88._12_4_;
  local_3d8._0_4_ = local_398._0_4_ + auVar103._0_4_ * 0.33333334;
  local_3d8._4_4_ = local_398._4_4_ + auVar103._4_4_ * 0.33333334;
  fStack_3d0 = local_398._8_4_ + auVar103._8_4_ * 0.33333334;
  fStack_3cc = local_398._12_4_ + auVar103._12_4_ * 0.33333334;
  auVar72._0_4_ = auVar96._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar96._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar96._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar96._12_4_ * 0.33333334;
  _local_3e8 = vsubps_avx(_local_3b8,auVar72);
  aVar5 = (ray->super_RayK<1>).org.field_0;
  auVar95 = vsubps_avx(_local_398,(undefined1  [16])aVar5);
  auVar177 = vmovsldup_avx(auVar95);
  auVar96 = vmovshdup_avx(auVar95);
  auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar172 = (pre->ray_space).vx.field_0.m128[0];
  fVar195 = (pre->ray_space).vx.field_0.m128[1];
  fVar189 = (pre->ray_space).vx.field_0.m128[2];
  fVar209 = (pre->ray_space).vx.field_0.m128[3];
  fVar190 = (pre->ray_space).vy.field_0.m128[0];
  fVar211 = (pre->ray_space).vy.field_0.m128[1];
  fVar191 = (pre->ray_space).vy.field_0.m128[2];
  fVar212 = (pre->ray_space).vy.field_0.m128[3];
  fVar192 = (pre->ray_space).vz.field_0.m128[0];
  fVar214 = (pre->ray_space).vz.field_0.m128[1];
  fVar193 = (pre->ray_space).vz.field_0.m128[2];
  fVar215 = (pre->ray_space).vz.field_0.m128[3];
  local_498._4_4_ = fVar195 * auVar177._4_4_ + fVar211 * auVar96._4_4_ + fVar214 * auVar95._4_4_;
  local_498._0_4_ = fVar172 * auVar177._0_4_ + fVar190 * auVar96._0_4_ + fVar192 * auVar95._0_4_;
  fStack_490 = fVar189 * auVar177._8_4_ + fVar191 * auVar96._8_4_ + fVar193 * auVar95._8_4_;
  fStack_48c = fVar209 * auVar177._12_4_ + fVar212 * auVar96._12_4_ + fVar215 * auVar95._12_4_;
  auVar95 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
  auVar177 = vmovsldup_avx(auVar95);
  auVar96 = vmovshdup_avx(auVar95);
  auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
  local_4a8._4_4_ = fVar195 * auVar177._4_4_ + auVar96._4_4_ * fVar211 + fVar214 * auVar95._4_4_;
  local_4a8._0_4_ = fVar172 * auVar177._0_4_ + auVar96._0_4_ * fVar190 + fVar192 * auVar95._0_4_;
  fStack_4a0 = fVar189 * auVar177._8_4_ + auVar96._8_4_ * fVar191 + fVar193 * auVar95._8_4_;
  fStack_49c = fVar209 * auVar177._12_4_ + auVar96._12_4_ * fVar212 + fVar215 * auVar95._12_4_;
  auVar177 = vsubps_avx(_local_3e8,(undefined1  [16])aVar5);
  auVar95 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar96 = vmovshdup_avx(auVar177);
  auVar177 = vmovsldup_avx(auVar177);
  auVar129._0_8_ =
       CONCAT44(auVar96._4_4_ * fVar211 + auVar95._4_4_ * fVar214 + fVar195 * auVar177._4_4_,
                auVar96._0_4_ * fVar190 + auVar95._0_4_ * fVar192 + fVar172 * auVar177._0_4_);
  auVar129._8_4_ = auVar96._8_4_ * fVar191 + auVar95._8_4_ * fVar193 + fVar189 * auVar177._8_4_;
  auVar129._12_4_ = auVar96._12_4_ * fVar212 + auVar95._12_4_ * fVar215 + fVar209 * auVar177._12_4_;
  auVar177 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
  auVar95 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar96 = vmovshdup_avx(auVar177);
  auVar177 = vmovsldup_avx(auVar177);
  auVar252._0_8_ =
       CONCAT44(auVar177._4_4_ * fVar195 + auVar96._4_4_ * fVar211 + auVar95._4_4_ * fVar214,
                auVar177._0_4_ * fVar172 + auVar96._0_4_ * fVar190 + auVar95._0_4_ * fVar192);
  auVar252._8_4_ = auVar177._8_4_ * fVar189 + auVar96._8_4_ * fVar191 + auVar95._8_4_ * fVar193;
  auVar252._12_4_ = auVar177._12_4_ * fVar209 + auVar96._12_4_ * fVar212 + auVar95._12_4_ * fVar215;
  auVar177 = vsubps_avx(_local_3a8,(undefined1  [16])aVar5);
  auVar95 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar96 = vmovshdup_avx(auVar177);
  auVar177 = vmovsldup_avx(auVar177);
  auVar89._0_4_ = auVar177._0_4_ * fVar172 + auVar96._0_4_ * fVar190 + auVar95._0_4_ * fVar192;
  auVar89._4_4_ = auVar177._4_4_ * fVar195 + auVar96._4_4_ * fVar211 + auVar95._4_4_ * fVar214;
  auVar89._8_4_ = auVar177._8_4_ * fVar189 + auVar96._8_4_ * fVar191 + auVar95._8_4_ * fVar193;
  auVar89._12_4_ = auVar177._12_4_ * fVar209 + auVar96._12_4_ * fVar212 + auVar95._12_4_ * fVar215;
  local_3f8._0_4_ = (float)local_3a8._0_4_ + (fVar194 + auVar178._0_4_) * 0.33333334;
  local_3f8._4_4_ = (float)local_3a8._4_4_ + (fVar217 + auVar178._4_4_) * 0.33333334;
  fStack_3f0 = fStack_3a0 + (fVar149 + auVar178._8_4_) * 0.33333334;
  fStack_3ec = fStack_39c + (fVar165 + auVar178._12_4_) * 0.33333334;
  auVar177 = vsubps_avx(_local_3f8,(undefined1  [16])aVar5);
  auVar95 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar96 = vmovshdup_avx(auVar177);
  auVar177 = vmovsldup_avx(auVar177);
  auVar240._0_8_ =
       CONCAT44(auVar177._4_4_ * fVar195 + auVar96._4_4_ * fVar211 + auVar95._4_4_ * fVar214,
                auVar177._0_4_ * fVar172 + auVar96._0_4_ * fVar190 + auVar95._0_4_ * fVar192);
  auVar240._8_4_ = auVar177._8_4_ * fVar189 + auVar96._8_4_ * fVar191 + auVar95._8_4_ * fVar193;
  auVar240._12_4_ = auVar177._12_4_ * fVar209 + auVar96._12_4_ * fVar212 + auVar95._12_4_ * fVar215;
  auVar220._0_4_ = (fVar166 + auVar71._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar167 + auVar71._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar169 + auVar71._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar170 + auVar71._12_4_) * 0.33333334;
  _local_2a8 = vsubps_avx(_local_3c8,auVar220);
  auVar177 = vsubps_avx(_local_2a8,(undefined1  [16])aVar5);
  auVar95 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar96 = vmovshdup_avx(auVar177);
  auVar177 = vmovsldup_avx(auVar177);
  auVar221._0_8_ =
       CONCAT44(auVar96._4_4_ * fVar211 + auVar95._4_4_ * fVar214 + fVar195 * auVar177._4_4_,
                auVar96._0_4_ * fVar190 + auVar95._0_4_ * fVar192 + fVar172 * auVar177._0_4_);
  auVar221._8_4_ = auVar96._8_4_ * fVar191 + auVar95._8_4_ * fVar193 + fVar189 * auVar177._8_4_;
  auVar221._12_4_ = auVar96._12_4_ * fVar212 + auVar95._12_4_ * fVar215 + fVar209 * auVar177._12_4_;
  auVar177 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
  auVar95 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar96 = vmovshdup_avx(auVar177);
  auVar177 = vmovsldup_avx(auVar177);
  auVar73._0_8_ =
       CONCAT44(fVar195 * auVar177._4_4_ + auVar96._4_4_ * fVar211 + auVar95._4_4_ * fVar214,
                fVar172 * auVar177._0_4_ + auVar96._0_4_ * fVar190 + auVar95._0_4_ * fVar192);
  auVar73._8_4_ = fVar189 * auVar177._8_4_ + auVar96._8_4_ * fVar191 + auVar95._8_4_ * fVar193;
  auVar73._12_4_ = fVar209 * auVar177._12_4_ + auVar96._12_4_ * fVar212 + auVar95._12_4_ * fVar215;
  _local_2e8 = vmovlhps_avx(_local_498,auVar89);
  _local_2f8 = vmovlhps_avx(_local_4a8,auVar240);
  _local_308 = vmovlhps_avx(auVar129,auVar221);
  auVar136 = vmovlhps_avx(auVar252,auVar73);
  auVar96 = vminps_avx(_local_2e8,_local_2f8);
  auVar177 = vminps_avx(_local_308,auVar136);
  auVar95 = vminps_avx(auVar96,auVar177);
  auVar96 = vmaxps_avx(_local_2e8,_local_2f8);
  auVar177 = vmaxps_avx(_local_308,auVar136);
  auVar96 = vmaxps_avx(auVar96,auVar177);
  auVar177 = vshufpd_avx(auVar95,auVar95,3);
  auVar95 = vminps_avx(auVar95,auVar177);
  auVar177 = vshufpd_avx(auVar96,auVar96,3);
  auVar177 = vmaxps_avx(auVar96,auVar177);
  auVar201._8_4_ = 0x7fffffff;
  auVar201._0_8_ = 0x7fffffff7fffffff;
  auVar201._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar95,auVar201);
  auVar177 = vandps_avx(auVar177,auVar201);
  auVar96 = vmaxps_avx(auVar96,auVar177);
  auVar177 = vmovshdup_avx(auVar96);
  auVar96 = vmaxss_avx(auVar177,auVar96);
  fVar172 = auVar96._0_4_ * 9.536743e-07;
  register0x00001388 = local_498;
  local_318 = local_498;
  register0x00001588 = local_4a8;
  local_328 = local_4a8;
  register0x00001488 = auVar129._0_8_;
  local_338 = auVar129._0_8_;
  register0x00001448 = auVar252._0_8_;
  local_348 = auVar252._0_8_;
  register0x00001408 = auVar240._0_8_;
  local_368 = auVar240._0_8_;
  register0x000013c8 = auVar221._0_8_;
  local_378 = auVar221._0_8_;
  register0x00001548 = auVar73._0_8_;
  local_388 = auVar73._0_8_;
  _local_4a8 = ZEXT416((uint)fVar172);
  auVar96 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
  local_138._16_16_ = auVar96;
  local_138._0_16_ = auVar96;
  auVar74._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
  auVar74._8_4_ = auVar96._8_4_ ^ 0x80000000;
  auVar74._12_4_ = auVar96._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar74;
  local_158._0_16_ = auVar74;
  uVar68 = 0;
  _local_1c8 = vsubps_avx(_local_2f8,_local_2e8);
  _local_1d8 = vsubps_avx(_local_308,_local_2f8);
  _local_498 = auVar136;
  _local_1e8 = vsubps_avx(auVar136,_local_308);
  _local_208 = vsubps_avx(_local_3a8,_local_398);
  _local_218 = vsubps_avx(_local_3f8,_local_3d8);
  _local_228 = vsubps_avx(_local_2a8,_local_3e8);
  _local_238 = vsubps_avx(_local_3c8,_local_3b8);
  local_4d8 = ZEXT816(0x3f80000000000000);
  local_358 = auVar89._8_4_;
  fStack_354 = auVar89._12_4_;
  fStack_350 = auVar89._8_4_;
  fStack_34c = auVar89._12_4_;
  local_1f8 = local_4d8;
  do {
    auVar96 = vshufps_avx(local_4d8,local_4d8,0x50);
    auVar316._8_4_ = 0x3f800000;
    auVar316._0_8_ = &DAT_3f8000003f800000;
    auVar316._12_4_ = 0x3f800000;
    auVar321._16_4_ = 0x3f800000;
    auVar321._0_16_ = auVar316;
    auVar321._20_4_ = 0x3f800000;
    auVar321._24_4_ = 0x3f800000;
    auVar321._28_4_ = 0x3f800000;
    auVar177 = vsubps_avx(auVar316,auVar96);
    fVar172 = auVar96._0_4_;
    fVar195 = auVar96._4_4_;
    fVar189 = auVar96._8_4_;
    fVar209 = auVar96._12_4_;
    fVar190 = auVar177._0_4_;
    fVar211 = auVar177._4_4_;
    fVar191 = auVar177._8_4_;
    fVar212 = auVar177._12_4_;
    auVar113._0_4_ = local_358 * fVar172 + fVar190 * local_318._0_4_;
    auVar113._4_4_ = fStack_354 * fVar195 + fVar211 * local_318._4_4_;
    auVar113._8_4_ = fStack_350 * fVar189 + fVar191 * local_318._8_4_;
    auVar113._12_4_ = fStack_34c * fVar209 + fVar212 * local_318._12_4_;
    auVar90._0_4_ = local_368._0_4_ * fVar172 + local_328._0_4_ * fVar190;
    auVar90._4_4_ = local_368._4_4_ * fVar195 + local_328._4_4_ * fVar211;
    auVar90._8_4_ = local_368._8_4_ * fVar189 + local_328._8_4_ * fVar191;
    auVar90._12_4_ = local_368._12_4_ * fVar209 + local_328._12_4_ * fVar212;
    auVar222._0_4_ = local_378._0_4_ * fVar172 + local_338._0_4_ * fVar190;
    auVar222._4_4_ = local_378._4_4_ * fVar195 + local_338._4_4_ * fVar211;
    auVar222._8_4_ = local_378._8_4_ * fVar189 + local_338._8_4_ * fVar191;
    auVar222._12_4_ = local_378._12_4_ * fVar209 + local_338._12_4_ * fVar212;
    auVar130._0_4_ = local_388._0_4_ * fVar172 + local_348._0_4_ * fVar190;
    auVar130._4_4_ = local_388._4_4_ * fVar195 + local_348._4_4_ * fVar211;
    auVar130._8_4_ = local_388._8_4_ * fVar189 + local_348._8_4_ * fVar191;
    auVar130._12_4_ = local_388._12_4_ * fVar209 + local_348._12_4_ * fVar212;
    auVar96 = vmovshdup_avx(local_1f8);
    auVar177 = vshufps_avx(local_1f8,local_1f8,0);
    auVar248._16_16_ = auVar177;
    auVar248._0_16_ = auVar177;
    auVar95 = vshufps_avx(local_1f8,local_1f8,0x55);
    auVar81._16_16_ = auVar95;
    auVar81._0_16_ = auVar95;
    auVar77 = vsubps_avx(auVar81,auVar248);
    auVar95 = vshufps_avx(auVar113,auVar113,0);
    auVar136 = vshufps_avx(auVar113,auVar113,0x55);
    auVar103 = vshufps_avx(auVar90,auVar90,0);
    auVar94 = vshufps_avx(auVar90,auVar90,0x55);
    auVar75 = vshufps_avx(auVar222,auVar222,0);
    auVar310 = vshufps_avx(auVar222,auVar222,0x55);
    auVar148 = vshufps_avx(auVar130,auVar130,0);
    auVar6 = vshufps_avx(auVar130,auVar130,0x55);
    auVar96 = ZEXT416((uint)((auVar96._0_4_ - local_1f8._0_4_) * 0.04761905));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar262._0_4_ = auVar177._0_4_ + auVar77._0_4_ * 0.0;
    auVar262._4_4_ = auVar177._4_4_ + auVar77._4_4_ * 0.14285715;
    auVar262._8_4_ = auVar177._8_4_ + auVar77._8_4_ * 0.2857143;
    auVar262._12_4_ = auVar177._12_4_ + auVar77._12_4_ * 0.42857146;
    auVar262._16_4_ = auVar177._0_4_ + auVar77._16_4_ * 0.5714286;
    auVar262._20_4_ = auVar177._4_4_ + auVar77._20_4_ * 0.71428573;
    auVar262._24_4_ = auVar177._8_4_ + auVar77._24_4_ * 0.8571429;
    auVar262._28_4_ = auVar177._12_4_ + auVar77._28_4_;
    auVar14 = vsubps_avx(auVar321,auVar262);
    fVar217 = auVar103._0_4_;
    fVar165 = auVar103._4_4_;
    fVar171 = auVar103._8_4_;
    fVar168 = auVar103._12_4_;
    fVar172 = auVar14._0_4_;
    fVar190 = auVar14._4_4_;
    fVar192 = auVar14._8_4_;
    fVar194 = auVar14._12_4_;
    fVar307 = auVar95._12_4_;
    fVar166 = auVar14._16_4_;
    fVar167 = auVar14._20_4_;
    fVar169 = auVar14._24_4_;
    fVar210 = auVar94._0_4_;
    fVar213 = auVar94._4_4_;
    fVar216 = auVar94._8_4_;
    fVar300 = auVar94._12_4_;
    local_418._0_4_ = auVar136._0_4_;
    local_418._4_4_ = auVar136._4_4_;
    fStack_410 = auVar136._8_4_;
    fStack_40c = auVar136._12_4_;
    fVar195 = auVar75._0_4_;
    fVar209 = auVar75._4_4_;
    fVar191 = auVar75._8_4_;
    fVar214 = auVar75._12_4_;
    fVar149 = auVar262._0_4_ * fVar195 + fVar217 * fVar172;
    fVar170 = auVar262._4_4_ * fVar209 + fVar165 * fVar190;
    fVar281 = auVar262._8_4_ * fVar191 + fVar171 * fVar192;
    fVar282 = auVar262._12_4_ * fVar214 + fVar168 * fVar194;
    fVar283 = auVar262._16_4_ * fVar195 + fVar217 * fVar166;
    fVar284 = auVar262._20_4_ * fVar209 + fVar165 * fVar167;
    fVar285 = auVar262._24_4_ * fVar191 + fVar171 * fVar169;
    fVar189 = auVar310._0_4_;
    fVar211 = auVar310._4_4_;
    fVar212 = auVar310._8_4_;
    fVar193 = auVar310._12_4_;
    fVar286 = auVar262._0_4_ * fVar189 + fVar210 * fVar172;
    fVar291 = auVar262._4_4_ * fVar211 + fVar213 * fVar190;
    fVar292 = auVar262._8_4_ * fVar212 + fVar216 * fVar192;
    fVar293 = auVar262._12_4_ * fVar193 + fVar300 * fVar194;
    fVar294 = auVar262._16_4_ * fVar189 + fVar210 * fVar166;
    fVar296 = auVar262._20_4_ * fVar211 + fVar213 * fVar167;
    fVar298 = auVar262._24_4_ * fVar212 + fVar216 * fVar169;
    auVar177 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar136 = vshufps_avx(auVar113,auVar113,0xff);
    fVar215 = fVar214 + 0.0;
    auVar103 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar94 = vshufps_avx(auVar90,auVar90,0xff);
    auVar82._0_4_ =
         fVar172 * (fVar217 * auVar262._0_4_ + auVar95._0_4_ * fVar172) + auVar262._0_4_ * fVar149;
    auVar82._4_4_ =
         fVar190 * (fVar165 * auVar262._4_4_ + auVar95._4_4_ * fVar190) + auVar262._4_4_ * fVar170;
    auVar82._8_4_ =
         fVar192 * (fVar171 * auVar262._8_4_ + auVar95._8_4_ * fVar192) + auVar262._8_4_ * fVar281;
    auVar82._12_4_ =
         fVar194 * (fVar168 * auVar262._12_4_ + fVar307 * fVar194) + auVar262._12_4_ * fVar282;
    auVar82._16_4_ =
         fVar166 * (fVar217 * auVar262._16_4_ + auVar95._0_4_ * fVar166) + auVar262._16_4_ * fVar283
    ;
    auVar82._20_4_ =
         fVar167 * (fVar165 * auVar262._20_4_ + auVar95._4_4_ * fVar167) + auVar262._20_4_ * fVar284
    ;
    auVar82._24_4_ =
         fVar169 * (fVar171 * auVar262._24_4_ + auVar95._8_4_ * fVar169) + auVar262._24_4_ * fVar285
    ;
    auVar82._28_4_ = fVar307 + 1.0 + fVar193;
    auVar144._0_4_ =
         fVar172 * (fVar210 * auVar262._0_4_ + fVar172 * (float)local_418._0_4_) +
         auVar262._0_4_ * fVar286;
    auVar144._4_4_ =
         fVar190 * (fVar213 * auVar262._4_4_ + fVar190 * (float)local_418._4_4_) +
         auVar262._4_4_ * fVar291;
    auVar144._8_4_ =
         fVar192 * (fVar216 * auVar262._8_4_ + fVar192 * fStack_410) + auVar262._8_4_ * fVar292;
    auVar144._12_4_ =
         fVar194 * (fVar300 * auVar262._12_4_ + fVar194 * fStack_40c) + auVar262._12_4_ * fVar293;
    auVar144._16_4_ =
         fVar166 * (fVar210 * auVar262._16_4_ + fVar166 * (float)local_418._0_4_) +
         auVar262._16_4_ * fVar294;
    auVar144._20_4_ =
         fVar167 * (fVar213 * auVar262._20_4_ + fVar167 * (float)local_418._4_4_) +
         auVar262._20_4_ * fVar296;
    auVar144._24_4_ =
         fVar169 * (fVar216 * auVar262._24_4_ + fVar169 * fStack_410) + auVar262._24_4_ * fVar298;
    auVar144._28_4_ = fVar307 + 1.0 + fVar193;
    auVar162._0_4_ =
         fVar172 * fVar149 + auVar262._0_4_ * (auVar148._0_4_ * auVar262._0_4_ + fVar172 * fVar195);
    auVar162._4_4_ =
         fVar190 * fVar170 + auVar262._4_4_ * (auVar148._4_4_ * auVar262._4_4_ + fVar190 * fVar209);
    auVar162._8_4_ =
         fVar192 * fVar281 + auVar262._8_4_ * (auVar148._8_4_ * auVar262._8_4_ + fVar192 * fVar191);
    auVar162._12_4_ =
         fVar194 * fVar282 +
         auVar262._12_4_ * (auVar148._12_4_ * auVar262._12_4_ + fVar194 * fVar214);
    auVar162._16_4_ =
         fVar166 * fVar283 +
         auVar262._16_4_ * (auVar148._0_4_ * auVar262._16_4_ + fVar166 * fVar195);
    auVar162._20_4_ =
         fVar167 * fVar284 +
         auVar262._20_4_ * (auVar148._4_4_ * auVar262._20_4_ + fVar167 * fVar209);
    auVar162._24_4_ =
         fVar169 * fVar285 +
         auVar262._24_4_ * (auVar148._8_4_ * auVar262._24_4_ + fVar169 * fVar191);
    auVar162._28_4_ = fVar193 + fVar215;
    auVar272._0_4_ =
         fVar172 * fVar286 + auVar262._0_4_ * (auVar6._0_4_ * auVar262._0_4_ + fVar172 * fVar189);
    auVar272._4_4_ =
         fVar190 * fVar291 + auVar262._4_4_ * (auVar6._4_4_ * auVar262._4_4_ + fVar190 * fVar211);
    auVar272._8_4_ =
         fVar192 * fVar292 + auVar262._8_4_ * (auVar6._8_4_ * auVar262._8_4_ + fVar192 * fVar212);
    auVar272._12_4_ =
         fVar194 * fVar293 + auVar262._12_4_ * (auVar6._12_4_ * auVar262._12_4_ + fVar194 * fVar193)
    ;
    auVar272._16_4_ =
         fVar166 * fVar294 + auVar262._16_4_ * (auVar6._0_4_ * auVar262._16_4_ + fVar166 * fVar189);
    auVar272._20_4_ =
         fVar167 * fVar296 + auVar262._20_4_ * (auVar6._4_4_ * auVar262._20_4_ + fVar167 * fVar211);
    auVar272._24_4_ =
         fVar169 * fVar298 + auVar262._24_4_ * (auVar6._8_4_ * auVar262._24_4_ + fVar169 * fVar212);
    auVar272._28_4_ = fVar215 + fVar193 + 0.0;
    local_78._0_4_ = fVar172 * auVar82._0_4_ + auVar262._0_4_ * auVar162._0_4_;
    local_78._4_4_ = fVar190 * auVar82._4_4_ + auVar262._4_4_ * auVar162._4_4_;
    local_78._8_4_ = fVar192 * auVar82._8_4_ + auVar262._8_4_ * auVar162._8_4_;
    local_78._12_4_ = fVar194 * auVar82._12_4_ + auVar262._12_4_ * auVar162._12_4_;
    local_78._16_4_ = fVar166 * auVar82._16_4_ + auVar262._16_4_ * auVar162._16_4_;
    local_78._20_4_ = fVar167 * auVar82._20_4_ + auVar262._20_4_ * auVar162._20_4_;
    local_78._24_4_ = fVar169 * auVar82._24_4_ + auVar262._24_4_ * auVar162._24_4_;
    local_78._28_4_ = fVar307 + fVar168 + fVar193 + 0.0;
    local_98._0_4_ = fVar172 * auVar144._0_4_ + auVar262._0_4_ * auVar272._0_4_;
    local_98._4_4_ = fVar190 * auVar144._4_4_ + auVar262._4_4_ * auVar272._4_4_;
    local_98._8_4_ = fVar192 * auVar144._8_4_ + auVar262._8_4_ * auVar272._8_4_;
    local_98._12_4_ = fVar194 * auVar144._12_4_ + auVar262._12_4_ * auVar272._12_4_;
    local_98._16_4_ = fVar166 * auVar144._16_4_ + auVar262._16_4_ * auVar272._16_4_;
    local_98._20_4_ = fVar167 * auVar144._20_4_ + auVar262._20_4_ * auVar272._20_4_;
    local_98._24_4_ = fVar169 * auVar144._24_4_ + auVar262._24_4_ * auVar272._24_4_;
    local_98._28_4_ = fVar307 + fVar168 + fVar215;
    auVar15 = vsubps_avx(auVar162,auVar82);
    auVar77 = vsubps_avx(auVar272,auVar144);
    local_478._0_4_ = auVar96._0_4_;
    local_478._4_4_ = auVar96._4_4_;
    fStack_470 = auVar96._8_4_;
    fStack_46c = auVar96._12_4_;
    local_d8 = (float)local_478._0_4_ * auVar15._0_4_ * 3.0;
    fStack_d4 = (float)local_478._4_4_ * auVar15._4_4_ * 3.0;
    auVar24._4_4_ = fStack_d4;
    auVar24._0_4_ = local_d8;
    fStack_d0 = fStack_470 * auVar15._8_4_ * 3.0;
    auVar24._8_4_ = fStack_d0;
    fStack_cc = fStack_46c * auVar15._12_4_ * 3.0;
    auVar24._12_4_ = fStack_cc;
    fStack_c8 = (float)local_478._0_4_ * auVar15._16_4_ * 3.0;
    auVar24._16_4_ = fStack_c8;
    fStack_c4 = (float)local_478._4_4_ * auVar15._20_4_ * 3.0;
    auVar24._20_4_ = fStack_c4;
    fStack_c0 = fStack_470 * auVar15._24_4_ * 3.0;
    auVar24._24_4_ = fStack_c0;
    auVar24._28_4_ = auVar15._28_4_;
    fVar170 = (float)local_478._0_4_ * auVar77._0_4_ * 3.0;
    fVar171 = (float)local_478._4_4_ * auVar77._4_4_ * 3.0;
    auVar25._4_4_ = fVar171;
    auVar25._0_4_ = fVar170;
    fVar281 = fStack_470 * auVar77._8_4_ * 3.0;
    auVar25._8_4_ = fVar281;
    fVar168 = fStack_46c * auVar77._12_4_ * 3.0;
    auVar25._12_4_ = fVar168;
    fVar282 = (float)local_478._0_4_ * auVar77._16_4_ * 3.0;
    auVar25._16_4_ = fVar282;
    fVar283 = (float)local_478._4_4_ * auVar77._20_4_ * 3.0;
    auVar25._20_4_ = fVar283;
    fVar284 = fStack_470 * auVar77._24_4_ * 3.0;
    auVar25._24_4_ = fVar284;
    auVar25._28_4_ = auVar162._28_4_;
    auVar16 = vsubps_avx(local_78,auVar24);
    auVar77 = vperm2f128_avx(auVar16,auVar16,1);
    auVar77 = vshufps_avx(auVar77,auVar16,0x30);
    _local_418 = vshufps_avx(auVar16,auVar77,0x29);
    auVar107 = _local_418;
    auVar16 = vsubps_avx(local_98,auVar25);
    auVar77 = vperm2f128_avx(auVar16,auVar16,1);
    auVar77 = vshufps_avx(auVar77,auVar16,0x30);
    _local_458 = vshufps_avx(auVar16,auVar77,0x29);
    fVar309 = auVar103._0_4_;
    fVar314 = auVar103._4_4_;
    fVar315 = auVar103._8_4_;
    fVar195 = auVar94._0_4_;
    fVar211 = auVar94._4_4_;
    fVar214 = auVar94._8_4_;
    fVar217 = auVar94._12_4_;
    fVar308 = auVar136._12_4_;
    auVar96 = vshufps_avx(auVar222,auVar222,0xaa);
    fVar189 = auVar96._0_4_;
    fVar191 = auVar96._4_4_;
    fVar193 = auVar96._8_4_;
    fVar149 = auVar96._12_4_;
    fVar293 = auVar262._0_4_ * fVar189 + fVar309 * fVar172;
    fVar294 = auVar262._4_4_ * fVar191 + fVar314 * fVar190;
    fVar296 = auVar262._8_4_ * fVar193 + fVar315 * fVar192;
    fVar298 = auVar262._12_4_ * fVar149 + auVar103._12_4_ * fVar194;
    fVar295 = auVar262._16_4_ * fVar189 + fVar309 * fVar166;
    fVar297 = auVar262._20_4_ * fVar191 + fVar314 * fVar167;
    fVar299 = auVar262._24_4_ * fVar193 + fVar315 * fVar169;
    fVar300 = fVar308 + fVar307 + fVar300;
    auVar96 = vshufps_avx(auVar222,auVar222,0xff);
    fVar209 = auVar96._0_4_;
    fVar212 = auVar96._4_4_;
    fVar215 = auVar96._8_4_;
    fVar165 = auVar96._12_4_;
    fVar285 = auVar262._0_4_ * fVar209 + fVar172 * fVar195;
    fVar210 = auVar262._4_4_ * fVar212 + fVar190 * fVar211;
    fVar286 = auVar262._8_4_ * fVar215 + fVar192 * fVar214;
    fVar213 = auVar262._12_4_ * fVar165 + fVar194 * fVar217;
    fVar291 = auVar262._16_4_ * fVar209 + fVar166 * fVar195;
    fVar216 = auVar262._20_4_ * fVar212 + fVar167 * fVar211;
    fVar292 = auVar262._24_4_ * fVar215 + fVar169 * fVar214;
    auVar96 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar95 = vshufps_avx(auVar130,auVar130,0xff);
    fVar307 = auVar95._12_4_;
    auVar83._0_4_ =
         auVar262._0_4_ * fVar293 + fVar172 * (fVar309 * auVar262._0_4_ + auVar177._0_4_ * fVar172);
    auVar83._4_4_ =
         auVar262._4_4_ * fVar294 + fVar190 * (fVar314 * auVar262._4_4_ + auVar177._4_4_ * fVar190);
    auVar83._8_4_ =
         auVar262._8_4_ * fVar296 + fVar192 * (fVar315 * auVar262._8_4_ + auVar177._8_4_ * fVar192);
    auVar83._12_4_ =
         auVar262._12_4_ * fVar298 +
         fVar194 * (auVar103._12_4_ * auVar262._12_4_ + auVar177._12_4_ * fVar194);
    auVar83._16_4_ =
         auVar262._16_4_ * fVar295 +
         fVar166 * (fVar309 * auVar262._16_4_ + auVar177._0_4_ * fVar166);
    auVar83._20_4_ =
         auVar262._20_4_ * fVar297 +
         fVar167 * (fVar314 * auVar262._20_4_ + auVar177._4_4_ * fVar167);
    auVar83._24_4_ =
         auVar262._24_4_ * fVar299 +
         fVar169 * (fVar315 * auVar262._24_4_ + auVar177._8_4_ * fVar169);
    auVar83._28_4_ = fVar307 + auVar16._28_4_ + auVar77._28_4_;
    auVar306._0_4_ =
         auVar262._0_4_ * fVar285 + fVar172 * (auVar262._0_4_ * fVar195 + auVar136._0_4_ * fVar172);
    auVar306._4_4_ =
         auVar262._4_4_ * fVar210 + fVar190 * (auVar262._4_4_ * fVar211 + auVar136._4_4_ * fVar190);
    auVar306._8_4_ =
         auVar262._8_4_ * fVar286 + fVar192 * (auVar262._8_4_ * fVar214 + auVar136._8_4_ * fVar192);
    auVar306._12_4_ =
         auVar262._12_4_ * fVar213 + fVar194 * (auVar262._12_4_ * fVar217 + fVar308 * fVar194);
    auVar306._16_4_ =
         auVar262._16_4_ * fVar291 +
         fVar166 * (auVar262._16_4_ * fVar195 + auVar136._0_4_ * fVar166);
    auVar306._20_4_ =
         auVar262._20_4_ * fVar216 +
         fVar167 * (auVar262._20_4_ * fVar211 + auVar136._4_4_ * fVar167);
    auVar306._24_4_ =
         auVar262._24_4_ * fVar292 +
         fVar169 * (auVar262._24_4_ * fVar214 + auVar136._8_4_ * fVar169);
    auVar306._28_4_ = fVar307 + auVar77._28_4_ + auVar162._28_4_;
    auVar77 = vperm2f128_avx(local_78,local_78,1);
    auVar77 = vshufps_avx(auVar77,local_78,0x30);
    _local_298 = vshufps_avx(local_78,auVar77,0x29);
    auVar163._0_4_ =
         fVar172 * fVar293 + auVar262._0_4_ * (auVar96._0_4_ * auVar262._0_4_ + fVar172 * fVar189);
    auVar163._4_4_ =
         fVar190 * fVar294 + auVar262._4_4_ * (auVar96._4_4_ * auVar262._4_4_ + fVar190 * fVar191);
    auVar163._8_4_ =
         fVar192 * fVar296 + auVar262._8_4_ * (auVar96._8_4_ * auVar262._8_4_ + fVar192 * fVar193);
    auVar163._12_4_ =
         fVar194 * fVar298 +
         auVar262._12_4_ * (auVar96._12_4_ * auVar262._12_4_ + fVar194 * fVar149);
    auVar163._16_4_ =
         fVar166 * fVar295 + auVar262._16_4_ * (auVar96._0_4_ * auVar262._16_4_ + fVar166 * fVar189)
    ;
    auVar163._20_4_ =
         fVar167 * fVar297 + auVar262._20_4_ * (auVar96._4_4_ * auVar262._20_4_ + fVar167 * fVar191)
    ;
    auVar163._24_4_ =
         fVar169 * fVar299 + auVar262._24_4_ * (auVar96._8_4_ * auVar262._24_4_ + fVar169 * fVar193)
    ;
    auVar163._28_4_ = fVar300 + auVar96._12_4_ + fVar149;
    auVar208._0_4_ =
         fVar172 * fVar285 + auVar262._0_4_ * (auVar95._0_4_ * auVar262._0_4_ + fVar172 * fVar209);
    auVar208._4_4_ =
         fVar190 * fVar210 + auVar262._4_4_ * (auVar95._4_4_ * auVar262._4_4_ + fVar190 * fVar212);
    auVar208._8_4_ =
         fVar192 * fVar286 + auVar262._8_4_ * (auVar95._8_4_ * auVar262._8_4_ + fVar192 * fVar215);
    auVar208._12_4_ =
         fVar194 * fVar213 + auVar262._12_4_ * (fVar307 * auVar262._12_4_ + fVar194 * fVar165);
    auVar208._16_4_ =
         fVar166 * fVar291 + auVar262._16_4_ * (auVar95._0_4_ * auVar262._16_4_ + fVar166 * fVar209)
    ;
    auVar208._20_4_ =
         fVar167 * fVar216 + auVar262._20_4_ * (auVar95._4_4_ * auVar262._20_4_ + fVar167 * fVar212)
    ;
    auVar208._24_4_ =
         fVar169 * fVar292 + auVar262._24_4_ * (auVar95._8_4_ * auVar262._24_4_ + fVar169 * fVar215)
    ;
    auVar208._28_4_ = fVar308 + fVar217 + fVar307 + fVar165;
    auVar233._0_4_ = fVar172 * auVar83._0_4_ + auVar262._0_4_ * auVar163._0_4_;
    auVar233._4_4_ = fVar190 * auVar83._4_4_ + auVar262._4_4_ * auVar163._4_4_;
    auVar233._8_4_ = fVar192 * auVar83._8_4_ + auVar262._8_4_ * auVar163._8_4_;
    auVar233._12_4_ = fVar194 * auVar83._12_4_ + auVar262._12_4_ * auVar163._12_4_;
    auVar233._16_4_ = fVar166 * auVar83._16_4_ + auVar262._16_4_ * auVar163._16_4_;
    auVar233._20_4_ = fVar167 * auVar83._20_4_ + auVar262._20_4_ * auVar163._20_4_;
    auVar233._24_4_ = fVar169 * auVar83._24_4_ + auVar262._24_4_ * auVar163._24_4_;
    auVar233._28_4_ = fVar300 + fVar307 + fVar165;
    auVar249._0_4_ = fVar172 * auVar306._0_4_ + auVar262._0_4_ * auVar208._0_4_;
    auVar249._4_4_ = fVar190 * auVar306._4_4_ + auVar262._4_4_ * auVar208._4_4_;
    auVar249._8_4_ = fVar192 * auVar306._8_4_ + auVar262._8_4_ * auVar208._8_4_;
    auVar249._12_4_ = fVar194 * auVar306._12_4_ + auVar262._12_4_ * auVar208._12_4_;
    auVar249._16_4_ = fVar166 * auVar306._16_4_ + auVar262._16_4_ * auVar208._16_4_;
    auVar249._20_4_ = fVar167 * auVar306._20_4_ + auVar262._20_4_ * auVar208._20_4_;
    auVar249._24_4_ = fVar169 * auVar306._24_4_ + auVar262._24_4_ * auVar208._24_4_;
    auVar249._28_4_ = auVar14._28_4_ + auVar262._28_4_;
    auVar77 = vsubps_avx(auVar163,auVar83);
    auVar14 = vsubps_avx(auVar208,auVar306);
    local_f8 = (float)local_478._0_4_ * auVar77._0_4_ * 3.0;
    fStack_f4 = (float)local_478._4_4_ * auVar77._4_4_ * 3.0;
    auVar26._4_4_ = fStack_f4;
    auVar26._0_4_ = local_f8;
    fStack_f0 = fStack_470 * auVar77._8_4_ * 3.0;
    auVar26._8_4_ = fStack_f0;
    fStack_ec = fStack_46c * auVar77._12_4_ * 3.0;
    auVar26._12_4_ = fStack_ec;
    fStack_e8 = (float)local_478._0_4_ * auVar77._16_4_ * 3.0;
    auVar26._16_4_ = fStack_e8;
    fStack_e4 = (float)local_478._4_4_ * auVar77._20_4_ * 3.0;
    auVar26._20_4_ = fStack_e4;
    fStack_e0 = fStack_470 * auVar77._24_4_ * 3.0;
    auVar26._24_4_ = fStack_e0;
    auVar26._28_4_ = auVar208._28_4_;
    local_118 = (float)local_478._0_4_ * auVar14._0_4_ * 3.0;
    fStack_114 = (float)local_478._4_4_ * auVar14._4_4_ * 3.0;
    auVar27._4_4_ = fStack_114;
    auVar27._0_4_ = local_118;
    fStack_110 = fStack_470 * auVar14._8_4_ * 3.0;
    auVar27._8_4_ = fStack_110;
    fStack_10c = fStack_46c * auVar14._12_4_ * 3.0;
    auVar27._12_4_ = fStack_10c;
    fStack_108 = (float)local_478._0_4_ * auVar14._16_4_ * 3.0;
    auVar27._16_4_ = fStack_108;
    fStack_104 = (float)local_478._4_4_ * auVar14._20_4_ * 3.0;
    auVar27._20_4_ = fStack_104;
    fStack_470 = fStack_470 * auVar14._24_4_ * 3.0;
    auVar27._24_4_ = fStack_470;
    auVar27._28_4_ = fStack_46c;
    auVar77 = vperm2f128_avx(auVar233,auVar233,1);
    auVar77 = vshufps_avx(auVar77,auVar233,0x30);
    auVar18 = vshufps_avx(auVar233,auVar77,0x29);
    auVar14 = vsubps_avx(auVar233,auVar26);
    auVar77 = vperm2f128_avx(auVar14,auVar14,1);
    auVar77 = vshufps_avx(auVar77,auVar14,0x30);
    local_438 = vshufps_avx(auVar14,auVar77,0x29);
    auVar14 = vsubps_avx(auVar249,auVar27);
    auVar77 = vperm2f128_avx(auVar14,auVar14,1);
    auVar77 = vshufps_avx(auVar77,auVar14,0x30);
    auVar19 = vshufps_avx(auVar14,auVar77,0x29);
    auVar16 = vsubps_avx(auVar233,local_78);
    auVar17 = vsubps_avx(auVar18,_local_298);
    fVar172 = auVar17._0_4_ + auVar16._0_4_;
    fVar195 = auVar17._4_4_ + auVar16._4_4_;
    fVar189 = auVar17._8_4_ + auVar16._8_4_;
    fVar209 = auVar17._12_4_ + auVar16._12_4_;
    fVar190 = auVar17._16_4_ + auVar16._16_4_;
    fVar211 = auVar17._20_4_ + auVar16._20_4_;
    fVar191 = auVar17._24_4_ + auVar16._24_4_;
    auVar14 = vperm2f128_avx(local_98,local_98,1);
    auVar14 = vshufps_avx(auVar14,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar14,0x29);
    auVar14 = vperm2f128_avx(auVar249,auVar249,1);
    auVar14 = vshufps_avx(auVar14,auVar249,0x30);
    auVar20 = vshufps_avx(auVar249,auVar14,0x29);
    auVar14 = vsubps_avx(auVar249,local_98);
    auVar21 = vsubps_avx(auVar20,local_b8);
    fVar212 = auVar14._0_4_ + auVar21._0_4_;
    fVar192 = auVar14._4_4_ + auVar21._4_4_;
    fVar214 = auVar14._8_4_ + auVar21._8_4_;
    fVar193 = auVar14._12_4_ + auVar21._12_4_;
    fVar215 = auVar14._16_4_ + auVar21._16_4_;
    fVar194 = auVar14._20_4_ + auVar21._20_4_;
    fVar217 = auVar14._24_4_ + auVar21._24_4_;
    fVar149 = auVar14._28_4_;
    auVar28._4_4_ = local_98._4_4_ * fVar195;
    auVar28._0_4_ = local_98._0_4_ * fVar172;
    auVar28._8_4_ = local_98._8_4_ * fVar189;
    auVar28._12_4_ = local_98._12_4_ * fVar209;
    auVar28._16_4_ = local_98._16_4_ * fVar190;
    auVar28._20_4_ = local_98._20_4_ * fVar211;
    auVar28._24_4_ = local_98._24_4_ * fVar191;
    auVar28._28_4_ = fVar149;
    auVar29._4_4_ = fVar192 * local_78._4_4_;
    auVar29._0_4_ = fVar212 * local_78._0_4_;
    auVar29._8_4_ = fVar214 * local_78._8_4_;
    auVar29._12_4_ = fVar193 * local_78._12_4_;
    auVar29._16_4_ = fVar215 * local_78._16_4_;
    auVar29._20_4_ = fVar194 * local_78._20_4_;
    auVar29._24_4_ = fVar217 * local_78._24_4_;
    auVar29._28_4_ = auVar77._28_4_;
    auVar77 = vsubps_avx(auVar28,auVar29);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar15._28_4_;
    fVar170 = local_98._0_4_ + fVar170;
    fVar171 = local_98._4_4_ + fVar171;
    fVar281 = local_98._8_4_ + fVar281;
    fVar168 = local_98._12_4_ + fVar168;
    fVar282 = local_98._16_4_ + fVar282;
    fVar283 = local_98._20_4_ + fVar283;
    fVar284 = local_98._24_4_ + fVar284;
    auVar30._4_4_ = fVar171 * fVar195;
    auVar30._0_4_ = fVar170 * fVar172;
    auVar30._8_4_ = fVar281 * fVar189;
    auVar30._12_4_ = fVar168 * fVar209;
    auVar30._16_4_ = fVar282 * fVar190;
    auVar30._20_4_ = fVar283 * fVar211;
    auVar30._24_4_ = fVar284 * fVar191;
    auVar30._28_4_ = fVar149;
    auVar31._4_4_ = fVar192 * fStack_d4;
    auVar31._0_4_ = fVar212 * local_d8;
    auVar31._8_4_ = fVar214 * fStack_d0;
    auVar31._12_4_ = fVar193 * fStack_cc;
    auVar31._16_4_ = fVar215 * fStack_c8;
    auVar31._20_4_ = fVar194 * fStack_c4;
    auVar31._24_4_ = fVar217 * fStack_c0;
    auVar31._28_4_ = fStack_bc;
    auVar15 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = local_458._4_4_ * fVar195;
    auVar32._0_4_ = local_458._0_4_ * fVar172;
    auVar32._8_4_ = local_458._8_4_ * fVar189;
    auVar32._12_4_ = local_458._12_4_ * fVar209;
    auVar32._16_4_ = local_458._16_4_ * fVar190;
    auVar32._20_4_ = local_458._20_4_ * fVar211;
    auVar32._24_4_ = local_458._24_4_ * fVar191;
    auVar32._28_4_ = fVar149;
    auVar33._4_4_ = fVar192 * (float)local_418._4_4_;
    auVar33._0_4_ = fVar212 * (float)local_418._0_4_;
    auVar33._8_4_ = fVar214 * fStack_410;
    auVar33._12_4_ = fVar193 * fStack_40c;
    auVar33._16_4_ = fVar215 * fStack_408;
    auVar33._20_4_ = fVar194 * fStack_404;
    auVar33._24_4_ = fVar217 * fStack_400;
    auVar33._28_4_ = 0x40400000;
    auVar22 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_b8._4_4_ * fVar195;
    auVar34._0_4_ = local_b8._0_4_ * fVar172;
    auVar34._8_4_ = local_b8._8_4_ * fVar189;
    auVar34._12_4_ = local_b8._12_4_ * fVar209;
    auVar34._16_4_ = local_b8._16_4_ * fVar190;
    auVar34._20_4_ = local_b8._20_4_ * fVar211;
    auVar34._24_4_ = local_b8._24_4_ * fVar191;
    auVar34._28_4_ = fVar149;
    auVar35._4_4_ = local_298._4_4_ * fVar192;
    auVar35._0_4_ = local_298._0_4_ * fVar212;
    auVar35._8_4_ = local_298._8_4_ * fVar214;
    auVar35._12_4_ = local_298._12_4_ * fVar193;
    auVar35._16_4_ = local_298._16_4_ * fVar215;
    auVar35._20_4_ = local_298._20_4_ * fVar194;
    auVar35._24_4_ = local_298._24_4_ * fVar217;
    auVar35._28_4_ = local_b8._28_4_;
    auVar23 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar249._4_4_ * fVar195;
    auVar36._0_4_ = auVar249._0_4_ * fVar172;
    auVar36._8_4_ = auVar249._8_4_ * fVar189;
    auVar36._12_4_ = auVar249._12_4_ * fVar209;
    auVar36._16_4_ = auVar249._16_4_ * fVar190;
    auVar36._20_4_ = auVar249._20_4_ * fVar211;
    auVar36._24_4_ = auVar249._24_4_ * fVar191;
    auVar36._28_4_ = fVar149;
    auVar37._4_4_ = fVar192 * auVar233._4_4_;
    auVar37._0_4_ = fVar212 * auVar233._0_4_;
    auVar37._8_4_ = fVar214 * auVar233._8_4_;
    auVar37._12_4_ = fVar193 * auVar233._12_4_;
    auVar37._16_4_ = fVar215 * auVar233._16_4_;
    auVar37._20_4_ = fVar194 * auVar233._20_4_;
    auVar37._24_4_ = fVar217 * auVar233._24_4_;
    auVar37._28_4_ = local_458._28_4_;
    auVar78 = vsubps_avx(auVar36,auVar37);
    local_f8 = auVar233._0_4_ + local_f8;
    fStack_f4 = auVar233._4_4_ + fStack_f4;
    fStack_f0 = auVar233._8_4_ + fStack_f0;
    fStack_ec = auVar233._12_4_ + fStack_ec;
    fStack_e8 = auVar233._16_4_ + fStack_e8;
    fStack_e4 = auVar233._20_4_ + fStack_e4;
    fStack_e0 = auVar233._24_4_ + fStack_e0;
    fStack_dc = auVar233._28_4_ + auVar208._28_4_;
    local_118 = auVar249._0_4_ + local_118;
    fStack_114 = auVar249._4_4_ + fStack_114;
    fStack_110 = auVar249._8_4_ + fStack_110;
    fStack_10c = auVar249._12_4_ + fStack_10c;
    fStack_108 = auVar249._16_4_ + fStack_108;
    fStack_104 = auVar249._20_4_ + fStack_104;
    fStack_100 = auVar249._24_4_ + fStack_470;
    fStack_fc = auVar249._28_4_ + fStack_46c;
    auVar38._4_4_ = fStack_114 * fVar195;
    auVar38._0_4_ = local_118 * fVar172;
    auVar38._8_4_ = fStack_110 * fVar189;
    auVar38._12_4_ = fStack_10c * fVar209;
    auVar38._16_4_ = fStack_108 * fVar190;
    auVar38._20_4_ = fStack_104 * fVar211;
    auVar38._24_4_ = fStack_100 * fVar191;
    auVar38._28_4_ = auVar249._28_4_ + fStack_46c;
    auVar39._4_4_ = fStack_f4 * fVar192;
    auVar39._0_4_ = local_f8 * fVar212;
    auVar39._8_4_ = fStack_f0 * fVar214;
    auVar39._12_4_ = fStack_ec * fVar193;
    auVar39._16_4_ = fStack_e8 * fVar215;
    auVar39._20_4_ = fStack_e4 * fVar194;
    auVar39._24_4_ = fStack_e0 * fVar217;
    auVar39._28_4_ = fStack_dc;
    auVar79 = vsubps_avx(auVar38,auVar39);
    _local_478 = auVar19;
    auVar40._4_4_ = auVar19._4_4_ * fVar195;
    auVar40._0_4_ = auVar19._0_4_ * fVar172;
    auVar40._8_4_ = auVar19._8_4_ * fVar189;
    auVar40._12_4_ = auVar19._12_4_ * fVar209;
    auVar40._16_4_ = auVar19._16_4_ * fVar190;
    auVar40._20_4_ = auVar19._20_4_ * fVar211;
    auVar40._24_4_ = auVar19._24_4_ * fVar191;
    auVar40._28_4_ = fStack_dc;
    auVar41._4_4_ = fVar192 * local_438._4_4_;
    auVar41._0_4_ = fVar212 * local_438._0_4_;
    auVar41._8_4_ = fVar214 * local_438._8_4_;
    auVar41._12_4_ = fVar193 * local_438._12_4_;
    auVar41._16_4_ = fVar215 * local_438._16_4_;
    auVar41._20_4_ = fVar194 * local_438._20_4_;
    auVar41._24_4_ = fVar217 * local_438._24_4_;
    auVar41._28_4_ = local_438._28_4_;
    auVar106 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = auVar20._4_4_ * fVar195;
    auVar42._0_4_ = auVar20._0_4_ * fVar172;
    auVar42._8_4_ = auVar20._8_4_ * fVar189;
    auVar42._12_4_ = auVar20._12_4_ * fVar209;
    auVar42._16_4_ = auVar20._16_4_ * fVar190;
    auVar42._20_4_ = auVar20._20_4_ * fVar211;
    auVar42._24_4_ = auVar20._24_4_ * fVar191;
    auVar42._28_4_ = auVar17._28_4_ + auVar16._28_4_;
    auVar43._4_4_ = auVar18._4_4_ * fVar192;
    auVar43._0_4_ = auVar18._0_4_ * fVar212;
    auVar43._8_4_ = auVar18._8_4_ * fVar214;
    auVar43._12_4_ = auVar18._12_4_ * fVar193;
    auVar43._16_4_ = auVar18._16_4_ * fVar215;
    auVar43._20_4_ = auVar18._20_4_ * fVar194;
    auVar43._24_4_ = auVar18._24_4_ * fVar217;
    auVar43._28_4_ = fVar149 + auVar21._28_4_;
    auVar21 = vsubps_avx(auVar42,auVar43);
    auVar14 = vminps_avx(auVar77,auVar15);
    auVar77 = vmaxps_avx(auVar77,auVar15);
    auVar15 = vminps_avx(auVar22,auVar23);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar22,auVar23);
    auVar77 = vmaxps_avx(auVar77,auVar14);
    auVar16 = vminps_avx(auVar78,auVar79);
    auVar14 = vmaxps_avx(auVar78,auVar79);
    auVar17 = vminps_avx(auVar106,auVar21);
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar106,auVar21);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar77,auVar14);
    auVar77 = vcmpps_avx(auVar16,local_138,2);
    auVar14 = vcmpps_avx(auVar14,local_158,5);
    auVar77 = vandps_avx(auVar14,auVar77);
    auVar14 = local_1b8 & auVar77;
    uVar64 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(_local_298,local_78);
      auVar15 = vsubps_avx(auVar18,auVar233);
      fVar195 = auVar14._0_4_ + auVar15._0_4_;
      fVar189 = auVar14._4_4_ + auVar15._4_4_;
      fVar209 = auVar14._8_4_ + auVar15._8_4_;
      fVar190 = auVar14._12_4_ + auVar15._12_4_;
      fVar211 = auVar14._16_4_ + auVar15._16_4_;
      fVar191 = auVar14._20_4_ + auVar15._20_4_;
      fVar212 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(local_b8,local_98);
      auVar17 = vsubps_avx(auVar20,auVar249);
      fVar192 = auVar16._0_4_ + auVar17._0_4_;
      fVar214 = auVar16._4_4_ + auVar17._4_4_;
      fVar193 = auVar16._8_4_ + auVar17._8_4_;
      fVar215 = auVar16._12_4_ + auVar17._12_4_;
      fVar194 = auVar16._16_4_ + auVar17._16_4_;
      fVar217 = auVar16._20_4_ + auVar17._20_4_;
      fVar149 = auVar16._24_4_ + auVar17._24_4_;
      fVar172 = auVar17._28_4_;
      auVar44._4_4_ = local_98._4_4_ * fVar189;
      auVar44._0_4_ = local_98._0_4_ * fVar195;
      auVar44._8_4_ = local_98._8_4_ * fVar209;
      auVar44._12_4_ = local_98._12_4_ * fVar190;
      auVar44._16_4_ = local_98._16_4_ * fVar211;
      auVar44._20_4_ = local_98._20_4_ * fVar191;
      auVar44._24_4_ = local_98._24_4_ * fVar212;
      auVar44._28_4_ = local_98._28_4_;
      auVar45._4_4_ = local_78._4_4_ * fVar214;
      auVar45._0_4_ = local_78._0_4_ * fVar192;
      auVar45._8_4_ = local_78._8_4_ * fVar193;
      auVar45._12_4_ = local_78._12_4_ * fVar215;
      auVar45._16_4_ = local_78._16_4_ * fVar194;
      auVar45._20_4_ = local_78._20_4_ * fVar217;
      auVar45._24_4_ = local_78._24_4_ * fVar149;
      auVar45._28_4_ = local_78._28_4_;
      auVar17 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar171 * fVar189;
      auVar46._0_4_ = fVar170 * fVar195;
      auVar46._8_4_ = fVar281 * fVar209;
      auVar46._12_4_ = fVar168 * fVar190;
      auVar46._16_4_ = fVar282 * fVar211;
      auVar46._20_4_ = fVar283 * fVar191;
      auVar46._24_4_ = fVar284 * fVar212;
      auVar46._28_4_ = local_98._28_4_;
      auVar47._4_4_ = fVar214 * fStack_d4;
      auVar47._0_4_ = fVar192 * local_d8;
      auVar47._8_4_ = fVar193 * fStack_d0;
      auVar47._12_4_ = fVar215 * fStack_cc;
      auVar47._16_4_ = fVar194 * fStack_c8;
      auVar47._20_4_ = fVar217 * fStack_c4;
      auVar47._24_4_ = fVar149 * fStack_c0;
      auVar47._28_4_ = fVar172;
      auVar21 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar189 * local_458._4_4_;
      auVar48._0_4_ = fVar195 * local_458._0_4_;
      auVar48._8_4_ = fVar209 * local_458._8_4_;
      auVar48._12_4_ = fVar190 * local_458._12_4_;
      auVar48._16_4_ = fVar211 * local_458._16_4_;
      auVar48._20_4_ = fVar191 * local_458._20_4_;
      auVar48._24_4_ = fVar212 * local_458._24_4_;
      auVar48._28_4_ = fVar172;
      auVar49._4_4_ = fVar214 * (float)local_418._4_4_;
      auVar49._0_4_ = fVar192 * (float)local_418._0_4_;
      auVar49._8_4_ = fVar193 * fStack_410;
      auVar49._12_4_ = fVar215 * fStack_40c;
      auVar49._16_4_ = fVar194 * fStack_408;
      auVar49._20_4_ = fVar217 * fStack_404;
      auVar49._24_4_ = fVar149 * fStack_400;
      auVar49._28_4_ = local_98._28_4_ + auVar162._28_4_;
      auVar22 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_b8._4_4_ * fVar189;
      auVar50._0_4_ = local_b8._0_4_ * fVar195;
      auVar50._8_4_ = local_b8._8_4_ * fVar209;
      auVar50._12_4_ = local_b8._12_4_ * fVar190;
      auVar50._16_4_ = local_b8._16_4_ * fVar211;
      auVar50._20_4_ = local_b8._20_4_ * fVar191;
      auVar50._24_4_ = local_b8._24_4_ * fVar212;
      auVar50._28_4_ = local_98._28_4_ + auVar162._28_4_;
      auVar51._4_4_ = local_298._4_4_ * fVar214;
      auVar51._0_4_ = local_298._0_4_ * fVar192;
      auVar51._8_4_ = local_298._8_4_ * fVar193;
      auVar51._12_4_ = local_298._12_4_ * fVar215;
      auVar51._16_4_ = local_298._16_4_ * fVar194;
      auVar51._20_4_ = local_298._20_4_ * fVar217;
      uVar2 = local_298._28_4_;
      auVar51._24_4_ = local_298._24_4_ * fVar149;
      auVar51._28_4_ = uVar2;
      auVar23 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar249._4_4_ * fVar189;
      auVar52._0_4_ = auVar249._0_4_ * fVar195;
      auVar52._8_4_ = auVar249._8_4_ * fVar209;
      auVar52._12_4_ = auVar249._12_4_ * fVar190;
      auVar52._16_4_ = auVar249._16_4_ * fVar211;
      auVar52._20_4_ = auVar249._20_4_ * fVar191;
      auVar52._24_4_ = auVar249._24_4_ * fVar212;
      auVar52._28_4_ = auVar249._28_4_;
      auVar53._4_4_ = auVar233._4_4_ * fVar214;
      auVar53._0_4_ = auVar233._0_4_ * fVar192;
      auVar53._8_4_ = auVar233._8_4_ * fVar193;
      auVar53._12_4_ = auVar233._12_4_ * fVar215;
      auVar53._16_4_ = auVar233._16_4_ * fVar194;
      auVar53._20_4_ = auVar233._20_4_ * fVar217;
      auVar53._24_4_ = auVar233._24_4_ * fVar149;
      auVar53._28_4_ = auVar233._28_4_;
      auVar78 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar189 * fStack_114;
      auVar54._0_4_ = fVar195 * local_118;
      auVar54._8_4_ = fVar209 * fStack_110;
      auVar54._12_4_ = fVar190 * fStack_10c;
      auVar54._16_4_ = fVar211 * fStack_108;
      auVar54._20_4_ = fVar191 * fStack_104;
      auVar54._24_4_ = fVar212 * fStack_100;
      auVar54._28_4_ = auVar249._28_4_;
      auVar55._4_4_ = fVar214 * fStack_f4;
      auVar55._0_4_ = fVar192 * local_f8;
      auVar55._8_4_ = fVar193 * fStack_f0;
      auVar55._12_4_ = fVar215 * fStack_ec;
      auVar55._16_4_ = fVar194 * fStack_e8;
      auVar55._20_4_ = fVar217 * fStack_e4;
      auVar55._24_4_ = fVar149 * fStack_e0;
      auVar55._28_4_ = uVar2;
      auVar79 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar189 * auVar19._4_4_;
      auVar56._0_4_ = fVar195 * auVar19._0_4_;
      auVar56._8_4_ = fVar209 * auVar19._8_4_;
      auVar56._12_4_ = fVar190 * auVar19._12_4_;
      auVar56._16_4_ = fVar211 * auVar19._16_4_;
      auVar56._20_4_ = fVar191 * auVar19._20_4_;
      auVar56._24_4_ = fVar212 * auVar19._24_4_;
      auVar56._28_4_ = uVar2;
      auVar57._4_4_ = fVar214 * local_438._4_4_;
      auVar57._0_4_ = fVar192 * local_438._0_4_;
      auVar57._8_4_ = fVar193 * local_438._8_4_;
      auVar57._12_4_ = fVar215 * local_438._12_4_;
      auVar57._16_4_ = fVar194 * local_438._16_4_;
      auVar57._20_4_ = fVar217 * local_438._20_4_;
      auVar57._24_4_ = fVar149 * local_438._24_4_;
      auVar57._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar20._4_4_ * fVar189;
      auVar58._0_4_ = auVar20._0_4_ * fVar195;
      auVar58._8_4_ = auVar20._8_4_ * fVar209;
      auVar58._12_4_ = auVar20._12_4_ * fVar190;
      auVar58._16_4_ = auVar20._16_4_ * fVar211;
      auVar58._20_4_ = auVar20._20_4_ * fVar191;
      auVar58._24_4_ = auVar20._24_4_ * fVar212;
      auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar59._4_4_ = auVar18._4_4_ * fVar214;
      auVar59._0_4_ = auVar18._0_4_ * fVar192;
      auVar59._8_4_ = auVar18._8_4_ * fVar193;
      auVar59._12_4_ = auVar18._12_4_ * fVar215;
      auVar59._16_4_ = auVar18._16_4_ * fVar194;
      auVar59._20_4_ = auVar18._20_4_ * fVar217;
      auVar59._24_4_ = auVar18._24_4_ * fVar149;
      auVar59._28_4_ = auVar16._28_4_ + fVar172;
      auVar20 = vsubps_avx(auVar58,auVar59);
      auVar15 = vminps_avx(auVar17,auVar21);
      auVar14 = vmaxps_avx(auVar17,auVar21);
      auVar16 = vminps_avx(auVar22,auVar23);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar22,auVar23);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar78,auVar79);
      auVar15 = vmaxps_avx(auVar78,auVar79);
      auVar18 = vminps_avx(auVar19,auVar20);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar20);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_138,2);
      auVar15 = vcmpps_avx(auVar15,local_158,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar77 = vandps_avx(auVar77,local_1b8);
      auVar15 = auVar77 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar77 = vandps_avx(auVar14,auVar77);
        uVar64 = vmovmskps_avx(auVar77);
      }
    }
    if (uVar64 != 0) {
      auStack_278[uVar68] = uVar64;
      uVar3 = vmovlps_avx(local_1f8);
      *(undefined8 *)(afStack_198 + uVar68 * 2) = uVar3;
      uVar4 = vmovlps_avx(local_4d8);
      auStack_58[uVar68] = uVar4;
      uVar68 = (ulong)((int)uVar68 + 1);
    }
    auVar313 = ZEXT864(0) << 0x20;
    _local_418 = auVar107;
    do {
      if ((int)uVar68 == 0) {
        fVar172 = (ray->super_RayK<1>).tfar;
        auVar84._4_4_ = fVar172;
        auVar84._0_4_ = fVar172;
        auVar84._8_4_ = fVar172;
        auVar84._12_4_ = fVar172;
        auVar84._16_4_ = fVar172;
        auVar84._20_4_ = fVar172;
        auVar84._24_4_ = fVar172;
        auVar84._28_4_ = fVar172;
        auVar77 = vcmpps_avx(local_178,auVar84,2);
        uVar63 = vmovmskps_avx(auVar77);
        uVar63 = (uint)uVar69 & uVar63;
        if (uVar63 == 0) {
          return;
        }
        goto LAB_01108e21;
      }
      uVar65 = (int)uVar68 - 1;
      uVar66 = (ulong)uVar65;
      uVar64 = auStack_278[uVar66];
      fVar172 = afStack_198[uVar66 * 2];
      fVar195 = afStack_198[uVar66 * 2 + 1];
      local_4d8._8_8_ = 0;
      local_4d8._0_8_ = auStack_58[uVar66];
      uVar4 = 0;
      if (uVar64 != 0) {
        for (; (uVar64 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar64 = uVar64 - 1 & uVar64;
      auStack_278[uVar66] = uVar64;
      if (uVar64 == 0) {
        uVar68 = (ulong)uVar65;
      }
      fVar209 = (float)(uVar4 + 1) * 0.14285715;
      fVar189 = (1.0 - (float)uVar4 * 0.14285715) * fVar172 + fVar195 * (float)uVar4 * 0.14285715;
      fVar172 = (1.0 - fVar209) * fVar172 + fVar195 * fVar209;
      fVar195 = fVar172 - fVar189;
      local_438 = ZEXT432((uint)fVar189);
      auVar77 = local_438;
      local_438._0_16_ = ZEXT416((uint)fVar189);
      auVar96 = local_438._0_16_;
      local_438._0_16_ = ZEXT416((uint)fVar189);
      _local_418 = ZEXT416((uint)fVar172);
      if (0.16666667 <= fVar195) break;
      auVar177 = vshufps_avx(local_4d8,local_4d8,0x50);
      auVar114._8_4_ = 0x3f800000;
      auVar114._0_8_ = &DAT_3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar95 = vsubps_avx(auVar114,auVar177);
      fVar209 = auVar177._0_4_;
      fVar190 = auVar177._4_4_;
      fVar211 = auVar177._8_4_;
      fVar191 = auVar177._12_4_;
      fVar212 = auVar95._0_4_;
      fVar192 = auVar95._4_4_;
      fVar214 = auVar95._8_4_;
      fVar193 = auVar95._12_4_;
      auVar131._0_4_ = local_358 * fVar209 + fVar212 * (float)local_318._0_4_;
      auVar131._4_4_ = fStack_354 * fVar190 + fVar192 * (float)local_318._4_4_;
      auVar131._8_4_ = fStack_350 * fVar211 + fVar214 * fStack_310;
      auVar131._12_4_ = fStack_34c * fVar191 + fVar193 * fStack_30c;
      auVar154._0_4_ = (float)local_368._0_4_ * fVar209 + fVar212 * (float)local_328._0_4_;
      auVar154._4_4_ = (float)local_368._4_4_ * fVar190 + fVar192 * (float)local_328._4_4_;
      auVar154._8_4_ = fStack_360 * fVar211 + fVar214 * fStack_320;
      auVar154._12_4_ = fStack_35c * fVar191 + fVar193 * fStack_31c;
      auVar179._0_4_ = (float)local_378._0_4_ * fVar209 + (float)local_338._0_4_ * fVar212;
      auVar179._4_4_ = (float)local_378._4_4_ * fVar190 + (float)local_338._4_4_ * fVar192;
      auVar179._8_4_ = fStack_370 * fVar211 + fStack_330 * fVar214;
      auVar179._12_4_ = fStack_36c * fVar191 + fStack_32c * fVar193;
      auVar91._0_4_ = (float)local_388._0_4_ * fVar209 + (float)local_348._0_4_ * fVar212;
      auVar91._4_4_ = (float)local_388._4_4_ * fVar190 + (float)local_348._4_4_ * fVar192;
      auVar91._8_4_ = fStack_380 * fVar211 + fStack_340 * fVar214;
      auVar91._12_4_ = fStack_37c * fVar191 + fStack_33c * fVar193;
      auVar124._16_16_ = auVar131;
      auVar124._0_16_ = auVar131;
      auVar145._16_16_ = auVar154;
      auVar145._0_16_ = auVar154;
      auVar164._16_16_ = auVar179;
      auVar164._0_16_ = auVar179;
      auVar14 = vshufps_avx(ZEXT2032(CONCAT416(fVar172,ZEXT416((uint)fVar189))),
                            ZEXT2032(CONCAT416(fVar172,ZEXT416((uint)fVar189))),0);
      auVar15 = vsubps_avx(auVar145,auVar124);
      fVar209 = auVar14._0_4_;
      fVar190 = auVar14._4_4_;
      fVar211 = auVar14._8_4_;
      fVar191 = auVar14._12_4_;
      fVar212 = auVar14._16_4_;
      fVar192 = auVar14._20_4_;
      fVar214 = auVar14._24_4_;
      auVar125._0_4_ = auVar131._0_4_ + auVar15._0_4_ * fVar209;
      auVar125._4_4_ = auVar131._4_4_ + auVar15._4_4_ * fVar190;
      auVar125._8_4_ = auVar131._8_4_ + auVar15._8_4_ * fVar211;
      auVar125._12_4_ = auVar131._12_4_ + auVar15._12_4_ * fVar191;
      auVar125._16_4_ = auVar131._0_4_ + auVar15._16_4_ * fVar212;
      auVar125._20_4_ = auVar131._4_4_ + auVar15._20_4_ * fVar192;
      auVar125._24_4_ = auVar131._8_4_ + auVar15._24_4_ * fVar214;
      auVar125._28_4_ = auVar131._12_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar164,auVar145);
      auVar146._0_4_ = auVar154._0_4_ + auVar15._0_4_ * fVar209;
      auVar146._4_4_ = auVar154._4_4_ + auVar15._4_4_ * fVar190;
      auVar146._8_4_ = auVar154._8_4_ + auVar15._8_4_ * fVar211;
      auVar146._12_4_ = auVar154._12_4_ + auVar15._12_4_ * fVar191;
      auVar146._16_4_ = auVar154._0_4_ + auVar15._16_4_ * fVar212;
      auVar146._20_4_ = auVar154._4_4_ + auVar15._20_4_ * fVar192;
      auVar146._24_4_ = auVar154._8_4_ + auVar15._24_4_ * fVar214;
      auVar146._28_4_ = auVar154._12_4_ + auVar15._28_4_;
      auVar177 = vsubps_avx(auVar91,auVar179);
      auVar110._0_4_ = auVar179._0_4_ + auVar177._0_4_ * fVar209;
      auVar110._4_4_ = auVar179._4_4_ + auVar177._4_4_ * fVar190;
      auVar110._8_4_ = auVar179._8_4_ + auVar177._8_4_ * fVar211;
      auVar110._12_4_ = auVar179._12_4_ + auVar177._12_4_ * fVar191;
      auVar110._16_4_ = auVar179._0_4_ + auVar177._0_4_ * fVar212;
      auVar110._20_4_ = auVar179._4_4_ + auVar177._4_4_ * fVar192;
      auVar110._24_4_ = auVar179._8_4_ + auVar177._8_4_ * fVar214;
      auVar110._28_4_ = auVar179._12_4_ + auVar177._12_4_;
      auVar15 = vsubps_avx(auVar146,auVar125);
      auVar126._0_4_ = auVar125._0_4_ + fVar209 * auVar15._0_4_;
      auVar126._4_4_ = auVar125._4_4_ + fVar190 * auVar15._4_4_;
      auVar126._8_4_ = auVar125._8_4_ + fVar211 * auVar15._8_4_;
      auVar126._12_4_ = auVar125._12_4_ + fVar191 * auVar15._12_4_;
      auVar126._16_4_ = auVar125._16_4_ + fVar212 * auVar15._16_4_;
      auVar126._20_4_ = auVar125._20_4_ + fVar192 * auVar15._20_4_;
      auVar126._24_4_ = auVar125._24_4_ + fVar214 * auVar15._24_4_;
      auVar126._28_4_ = auVar125._28_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar110,auVar146);
      auVar111._0_4_ = auVar146._0_4_ + fVar209 * auVar15._0_4_;
      auVar111._4_4_ = auVar146._4_4_ + fVar190 * auVar15._4_4_;
      auVar111._8_4_ = auVar146._8_4_ + fVar211 * auVar15._8_4_;
      auVar111._12_4_ = auVar146._12_4_ + fVar191 * auVar15._12_4_;
      auVar111._16_4_ = auVar146._16_4_ + fVar212 * auVar15._16_4_;
      auVar111._20_4_ = auVar146._20_4_ + fVar192 * auVar15._20_4_;
      auVar111._24_4_ = auVar146._24_4_ + fVar214 * auVar15._24_4_;
      auVar111._28_4_ = auVar146._28_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar111,auVar126);
      auVar132._0_4_ = auVar126._0_4_ + fVar209 * auVar15._0_4_;
      auVar132._4_4_ = auVar126._4_4_ + fVar190 * auVar15._4_4_;
      auVar132._8_4_ = auVar126._8_4_ + fVar211 * auVar15._8_4_;
      auVar132._12_4_ = auVar126._12_4_ + fVar191 * auVar15._12_4_;
      auVar147._16_4_ = auVar126._16_4_ + fVar212 * auVar15._16_4_;
      auVar147._0_16_ = auVar132;
      auVar147._20_4_ = auVar126._20_4_ + fVar192 * auVar15._20_4_;
      auVar147._24_4_ = auVar126._24_4_ + fVar214 * auVar15._24_4_;
      auVar147._28_4_ = auVar126._28_4_ + auVar146._28_4_;
      fVar209 = auVar15._4_4_ * 3.0;
      auVar148 = auVar147._16_16_;
      auVar94 = vshufps_avx(ZEXT416((uint)(fVar195 * 0.33333334)),
                            ZEXT416((uint)(fVar195 * 0.33333334)),0);
      auVar253._0_4_ = auVar132._0_4_ + auVar94._0_4_ * auVar15._0_4_ * 3.0;
      auVar253._4_4_ = auVar132._4_4_ + auVar94._4_4_ * fVar209;
      auVar253._8_4_ = auVar132._8_4_ + auVar94._8_4_ * auVar15._8_4_ * 3.0;
      auVar253._12_4_ = auVar132._12_4_ + auVar94._12_4_ * auVar15._12_4_ * 3.0;
      auVar136 = vshufpd_avx(auVar132,auVar132,3);
      auVar103 = vshufpd_avx(auVar148,auVar148,3);
      _local_298 = auVar136;
      auVar177 = vsubps_avx(auVar136,auVar132);
      _local_458 = auVar103;
      auVar95 = vsubps_avx(auVar103,auVar148);
      auVar92._0_4_ = auVar177._0_4_ + auVar95._0_4_;
      auVar92._4_4_ = auVar177._4_4_ + auVar95._4_4_;
      auVar92._8_4_ = auVar177._8_4_ + auVar95._8_4_;
      auVar92._12_4_ = auVar177._12_4_ + auVar95._12_4_;
      auVar177 = vmovshdup_avx(auVar132);
      auVar95 = vmovshdup_avx(auVar253);
      auVar75 = vshufps_avx(auVar92,auVar92,0);
      auVar310 = vshufps_avx(auVar92,auVar92,0x55);
      fVar192 = auVar310._0_4_;
      fVar214 = auVar310._4_4_;
      fVar193 = auVar310._8_4_;
      fVar215 = auVar310._12_4_;
      fVar190 = auVar75._0_4_;
      fVar211 = auVar75._4_4_;
      fVar191 = auVar75._8_4_;
      fVar212 = auVar75._12_4_;
      auVar241._0_4_ = fVar190 * auVar132._0_4_ + fVar192 * auVar177._0_4_;
      auVar241._4_4_ = fVar211 * auVar132._4_4_ + fVar214 * auVar177._4_4_;
      auVar241._8_4_ = fVar191 * auVar132._8_4_ + fVar193 * auVar177._8_4_;
      auVar241._12_4_ = fVar212 * auVar132._12_4_ + fVar215 * auVar177._12_4_;
      _local_478 = auVar253;
      auVar254._0_4_ = auVar253._0_4_ * fVar190 + fVar192 * auVar95._0_4_;
      auVar254._4_4_ = auVar253._4_4_ * fVar211 + fVar214 * auVar95._4_4_;
      auVar254._8_4_ = auVar253._8_4_ * fVar191 + fVar193 * auVar95._8_4_;
      auVar254._12_4_ = auVar253._12_4_ * fVar212 + fVar215 * auVar95._12_4_;
      auVar95 = vshufps_avx(auVar241,auVar241,0xe8);
      auVar75 = vshufps_avx(auVar254,auVar254,0xe8);
      auVar177 = vcmpps_avx(auVar95,auVar75,1);
      uVar64 = vextractps_avx(auVar177,0);
      auVar310 = auVar254;
      if ((uVar64 & 1) == 0) {
        auVar310 = auVar241;
      }
      auVar93._0_4_ = auVar94._0_4_ * auVar15._16_4_ * 3.0;
      auVar93._4_4_ = auVar94._4_4_ * fVar209;
      auVar93._8_4_ = auVar94._8_4_ * auVar15._24_4_ * 3.0;
      auVar93._12_4_ = auVar94._12_4_ * auVar14._28_4_;
      auVar7 = vsubps_avx(auVar148,auVar93);
      auVar94 = vmovshdup_avx(auVar7);
      auVar148 = vmovshdup_avx(auVar148);
      fVar209 = auVar7._0_4_;
      fVar194 = auVar7._4_4_;
      auVar317._0_4_ = fVar190 * fVar209 + fVar192 * auVar94._0_4_;
      auVar317._4_4_ = fVar211 * fVar194 + fVar214 * auVar94._4_4_;
      auVar317._8_4_ = fVar191 * auVar7._8_4_ + fVar193 * auVar94._8_4_;
      auVar317._12_4_ = fVar212 * auVar7._12_4_ + fVar215 * auVar94._12_4_;
      auVar302._0_4_ = fVar190 * auVar147._16_4_ + fVar192 * auVar148._0_4_;
      auVar302._4_4_ = fVar211 * auVar147._20_4_ + fVar214 * auVar148._4_4_;
      auVar302._8_4_ = fVar191 * auVar147._24_4_ + fVar193 * auVar148._8_4_;
      auVar302._12_4_ = fVar212 * auVar147._28_4_ + fVar215 * auVar148._12_4_;
      auVar148 = vshufps_avx(auVar317,auVar317,0xe8);
      auVar6 = vshufps_avx(auVar302,auVar302,0xe8);
      auVar94 = vcmpps_avx(auVar148,auVar6,1);
      uVar64 = vextractps_avx(auVar94,0);
      auVar223 = auVar302;
      if ((uVar64 & 1) == 0) {
        auVar223 = auVar317;
      }
      auVar310 = vmaxss_avx(auVar223,auVar310);
      auVar95 = vminps_avx(auVar95,auVar75);
      auVar75 = vminps_avx(auVar148,auVar6);
      auVar75 = vminps_avx(auVar95,auVar75);
      auVar177 = vshufps_avx(auVar177,auVar177,0x55);
      auVar177 = vblendps_avx(auVar177,auVar94,2);
      auVar94 = vpslld_avx(auVar177,0x1f);
      auVar177 = vshufpd_avx(auVar254,auVar254,1);
      auVar177 = vinsertps_avx(auVar177,auVar302,0x9c);
      auVar95 = vshufpd_avx(auVar241,auVar241,1);
      auVar95 = vinsertps_avx(auVar95,auVar317,0x9c);
      auVar177 = vblendvps_avx(auVar95,auVar177,auVar94);
      auVar95 = vmovshdup_avx(auVar177);
      auVar177 = vmaxss_avx(auVar95,auVar177);
      fVar191 = auVar75._0_4_;
      auVar95 = vmovshdup_avx(auVar75);
      fVar211 = auVar177._0_4_;
      fVar212 = auVar95._0_4_;
      fVar190 = auVar310._0_4_;
      local_438._0_16_ = auVar96;
      if ((0.0001 <= fVar191) || (fVar211 <= -0.0001)) {
        if ((-0.0001 < fVar190 && fVar212 < 0.0001) ||
           ((fVar191 < 0.0001 && -0.0001 < fVar190 || (fVar212 < 0.0001 && -0.0001 < fVar211))))
        goto LAB_0110a013;
LAB_0110aa79:
        bVar60 = true;
        auVar313 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0110a013:
        auVar313 = ZEXT864(0) << 0x20;
        auVar95 = vcmpps_avx(auVar75,ZEXT816(0) << 0x20,1);
        auVar96 = vcmpss_avx(auVar310,ZEXT416(0),1);
        auVar318._8_4_ = 0x3f800000;
        auVar318._0_8_ = &DAT_3f8000003f800000;
        auVar318._12_4_ = 0x3f800000;
        auVar180._8_4_ = 0xbf800000;
        auVar180._0_8_ = 0xbf800000bf800000;
        auVar180._12_4_ = 0xbf800000;
        auVar96 = vblendvps_avx(auVar318,auVar180,auVar96);
        auVar95 = vblendvps_avx(auVar318,auVar180,auVar95);
        auVar94 = vcmpss_avx(auVar96,auVar95,4);
        auVar94 = vpshufd_avx(ZEXT416(auVar94._0_4_ & 1),0x50);
        auVar94 = vpslld_avx(auVar94,0x1f);
        auVar94 = vpsrad_avx(auVar94,0x1f);
        auVar94 = vpandn_avx(auVar94,_DAT_02020eb0);
        auVar148 = vmovshdup_avx(auVar95);
        fVar192 = auVar148._0_4_;
        if ((auVar95._0_4_ != fVar192) || (NAN(auVar95._0_4_) || NAN(fVar192))) {
          if ((fVar212 != fVar191) || (NAN(fVar212) || NAN(fVar191))) {
            fVar191 = -fVar191 / (fVar212 - fVar191);
            auVar95 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar191) * 0.0 + fVar191)));
          }
          else {
            auVar95 = vcmpss_avx(auVar75,ZEXT416(0),0);
            auVar95 = vpshufd_avx(ZEXT416(auVar95._0_4_ & 1),0x50);
            auVar95 = vpslld_avx(auVar95,0x1f);
            auVar95 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar95);
          }
          auVar148 = vcmpps_avx(auVar94,auVar95,1);
          auVar75 = vblendps_avx(auVar94,auVar95,2);
          auVar95 = vblendps_avx(auVar95,auVar94,2);
          auVar94 = vblendvps_avx(auVar95,auVar75,auVar148);
        }
        auVar177 = vcmpss_avx(auVar177,ZEXT416(0),1);
        auVar115._8_4_ = 0xbf800000;
        auVar115._0_8_ = 0xbf800000bf800000;
        auVar115._12_4_ = 0xbf800000;
        auVar177 = vblendvps_avx(auVar318,auVar115,auVar177);
        fVar191 = auVar177._0_4_;
        if ((auVar96._0_4_ != fVar191) || (NAN(auVar96._0_4_) || NAN(fVar191))) {
          if ((fVar211 != fVar190) || (NAN(fVar211) || NAN(fVar190))) {
            fVar190 = -fVar190 / (fVar211 - fVar190);
            auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar190) * 0.0 + fVar190)));
          }
          else {
            auVar96 = vcmpss_avx(auVar310,ZEXT416(0),0);
            auVar96 = vpshufd_avx(ZEXT416(auVar96._0_4_ & 1),0x50);
            auVar96 = vpslld_avx(auVar96,0x1f);
            auVar96 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar96);
          }
          auVar95 = vcmpps_avx(auVar94,auVar96,1);
          auVar177 = vblendps_avx(auVar94,auVar96,2);
          auVar96 = vblendps_avx(auVar96,auVar94,2);
          auVar94 = vblendvps_avx(auVar96,auVar177,auVar95);
        }
        if ((fVar192 != fVar191) || (NAN(fVar192) || NAN(fVar191))) {
          auVar96 = vcmpps_avx(auVar94,auVar318,1);
          auVar177 = vinsertps_avx(auVar94,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar181._4_12_ = auVar94._4_12_;
          auVar181._0_4_ = 0x3f800000;
          auVar94 = vblendvps_avx(auVar181,auVar177,auVar96);
        }
        auVar96 = vcmpps_avx(auVar94,_DAT_01fec6f0,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar94._4_12_;
        auVar177 = vinsertps_avx(auVar94,ZEXT416(0x3f800000),0x10);
        auVar96 = vblendvps_avx(auVar177,auVar61 << 0x20,auVar96);
        auVar177 = vmovshdup_avx(auVar96);
        bVar60 = true;
        if (auVar96._0_4_ <= auVar177._0_4_) {
          auVar97._0_4_ = auVar96._0_4_ + -0.1;
          auVar97._4_4_ = auVar96._4_4_ + 0.1;
          auVar97._8_4_ = auVar96._8_4_ + 0.0;
          auVar97._12_4_ = auVar96._12_4_ + 0.0;
          auVar95 = vshufpd_avx(auVar253,auVar253,3);
          register0x000012c8 = 0x3f80000000000000;
          local_478 = 0x3f80000000000000;
          auVar96 = vcmpps_avx(auVar97,_local_478,1);
          auVar62._12_4_ = 0;
          auVar62._0_12_ = auVar97._4_12_;
          auVar177 = vinsertps_avx(auVar97,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar96 = vblendvps_avx(auVar177,auVar62 << 0x20,auVar96);
          auVar177 = vshufpd_avx(auVar7,auVar7,3);
          auVar94 = vshufps_avx(auVar96,auVar96,0x50);
          auVar75 = vsubps_avx(auVar318,auVar94);
          local_298._0_4_ = auVar136._0_4_;
          local_298._4_4_ = auVar136._4_4_;
          fStack_290 = auVar136._8_4_;
          fStack_28c = auVar136._12_4_;
          fVar190 = auVar94._0_4_;
          fVar211 = auVar94._4_4_;
          fVar191 = auVar94._8_4_;
          fVar212 = auVar94._12_4_;
          local_458._0_4_ = auVar103._0_4_;
          local_458._4_4_ = auVar103._4_4_;
          fStack_450 = auVar103._8_4_;
          fStack_44c = auVar103._12_4_;
          fVar192 = auVar75._0_4_;
          fVar214 = auVar75._4_4_;
          fVar193 = auVar75._8_4_;
          fVar215 = auVar75._12_4_;
          auVar116._0_4_ = fVar190 * (float)local_298._0_4_ + fVar192 * auVar132._0_4_;
          auVar116._4_4_ = fVar211 * (float)local_298._4_4_ + fVar214 * auVar132._4_4_;
          auVar116._8_4_ = fVar191 * fStack_290 + fVar193 * auVar132._0_4_;
          auVar116._12_4_ = fVar212 * fStack_28c + fVar215 * auVar132._4_4_;
          auVar155._0_4_ = fVar190 * auVar95._0_4_ + fVar192 * auVar253._0_4_;
          auVar155._4_4_ = fVar211 * auVar95._4_4_ + fVar214 * auVar253._4_4_;
          auVar155._8_4_ = fVar191 * auVar95._8_4_ + fVar193 * auVar253._0_4_;
          auVar155._12_4_ = fVar212 * auVar95._12_4_ + fVar215 * auVar253._4_4_;
          auVar224._0_4_ = fVar190 * auVar177._0_4_ + fVar192 * fVar209;
          auVar224._4_4_ = fVar211 * auVar177._4_4_ + fVar214 * fVar194;
          auVar224._8_4_ = fVar191 * auVar177._8_4_ + fVar193 * fVar209;
          auVar224._12_4_ = fVar212 * auVar177._12_4_ + fVar215 * fVar194;
          auVar242._0_4_ = fVar190 * (float)local_458._0_4_ + fVar192 * auVar147._16_4_;
          auVar242._4_4_ = fVar211 * (float)local_458._4_4_ + fVar214 * auVar147._20_4_;
          auVar242._8_4_ = fVar191 * fStack_450 + fVar193 * auVar147._16_4_;
          auVar242._12_4_ = fVar212 * fStack_44c + fVar215 * auVar147._20_4_;
          auVar136 = vsubps_avx(auVar318,auVar96);
          auVar177 = vmovshdup_avx(local_4d8);
          auVar95 = vmovsldup_avx(local_4d8);
          local_4d8._0_4_ = auVar136._0_4_ * auVar95._0_4_ + auVar177._0_4_ * auVar96._0_4_;
          local_4d8._4_4_ = auVar136._4_4_ * auVar95._4_4_ + auVar177._4_4_ * auVar96._4_4_;
          local_4d8._8_4_ = auVar136._8_4_ * auVar95._8_4_ + auVar177._8_4_ * auVar96._8_4_;
          local_4d8._12_4_ = auVar136._12_4_ * auVar95._12_4_ + auVar177._12_4_ * auVar96._12_4_;
          _local_458 = vmovshdup_avx(local_4d8);
          auVar96 = vsubps_avx(auVar155,auVar116);
          auVar182._0_4_ = auVar96._0_4_ * 3.0;
          auVar182._4_4_ = auVar96._4_4_ * 3.0;
          auVar182._8_4_ = auVar96._8_4_ * 3.0;
          auVar182._12_4_ = auVar96._12_4_ * 3.0;
          auVar96 = vsubps_avx(auVar224,auVar155);
          auVar202._0_4_ = auVar96._0_4_ * 3.0;
          auVar202._4_4_ = auVar96._4_4_ * 3.0;
          auVar202._8_4_ = auVar96._8_4_ * 3.0;
          auVar202._12_4_ = auVar96._12_4_ * 3.0;
          auVar96 = vsubps_avx(auVar242,auVar224);
          auVar255._0_4_ = auVar96._0_4_ * 3.0;
          auVar255._4_4_ = auVar96._4_4_ * 3.0;
          auVar255._8_4_ = auVar96._8_4_ * 3.0;
          auVar255._12_4_ = auVar96._12_4_ * 3.0;
          auVar177 = vminps_avx(auVar202,auVar255);
          auVar96 = vmaxps_avx(auVar202,auVar255);
          auVar177 = vminps_avx(auVar182,auVar177);
          auVar96 = vmaxps_avx(auVar182,auVar96);
          auVar95 = vshufpd_avx(auVar177,auVar177,3);
          auVar136 = vshufpd_avx(auVar96,auVar96,3);
          auVar177 = vminps_avx(auVar177,auVar95);
          auVar96 = vmaxps_avx(auVar96,auVar136);
          auVar95 = vshufps_avx(ZEXT416((uint)(1.0 / fVar195)),ZEXT416((uint)(1.0 / fVar195)),0);
          auVar183._0_4_ = auVar95._0_4_ * auVar177._0_4_;
          auVar183._4_4_ = auVar95._4_4_ * auVar177._4_4_;
          auVar183._8_4_ = auVar95._8_4_ * auVar177._8_4_;
          auVar183._12_4_ = auVar95._12_4_ * auVar177._12_4_;
          auVar203._0_4_ = auVar96._0_4_ * auVar95._0_4_;
          auVar203._4_4_ = auVar96._4_4_ * auVar95._4_4_;
          auVar203._8_4_ = auVar96._8_4_ * auVar95._8_4_;
          auVar203._12_4_ = auVar96._12_4_ * auVar95._12_4_;
          auVar75 = ZEXT416((uint)(1.0 / (local_458._0_4_ - local_4d8._0_4_)));
          auVar96 = vshufpd_avx(auVar116,auVar116,3);
          auVar177 = vshufpd_avx(auVar155,auVar155,3);
          auVar95 = vshufpd_avx(auVar224,auVar224,3);
          auVar136 = vshufpd_avx(auVar242,auVar242,3);
          auVar96 = vsubps_avx(auVar96,auVar116);
          auVar103 = vsubps_avx(auVar177,auVar155);
          auVar94 = vsubps_avx(auVar95,auVar224);
          auVar136 = vsubps_avx(auVar136,auVar242);
          auVar177 = vminps_avx(auVar96,auVar103);
          auVar96 = vmaxps_avx(auVar96,auVar103);
          auVar95 = vminps_avx(auVar94,auVar136);
          auVar95 = vminps_avx(auVar177,auVar95);
          auVar177 = vmaxps_avx(auVar94,auVar136);
          auVar96 = vmaxps_avx(auVar96,auVar177);
          auVar177 = vshufps_avx(auVar75,auVar75,0);
          auVar266._0_4_ = auVar177._0_4_ * auVar95._0_4_;
          auVar266._4_4_ = auVar177._4_4_ * auVar95._4_4_;
          auVar266._8_4_ = auVar177._8_4_ * auVar95._8_4_;
          auVar266._12_4_ = auVar177._12_4_ * auVar95._12_4_;
          auVar274._0_4_ = auVar177._0_4_ * auVar96._0_4_;
          auVar274._4_4_ = auVar177._4_4_ * auVar96._4_4_;
          auVar274._8_4_ = auVar177._8_4_ * auVar96._8_4_;
          auVar274._12_4_ = auVar177._12_4_ * auVar96._12_4_;
          auVar96 = vmovsldup_avx(local_4d8);
          auVar225._4_12_ = auVar96._4_12_;
          auVar225._0_4_ = fVar189;
          auVar243._4_12_ = local_4d8._4_12_;
          auVar243._0_4_ = fVar172;
          auVar76._0_4_ = (fVar172 + fVar189) * 0.5;
          auVar76._4_4_ = (local_4d8._4_4_ + auVar96._4_4_) * 0.5;
          auVar76._8_4_ = (local_4d8._8_4_ + auVar96._8_4_) * 0.5;
          auVar76._12_4_ = (local_4d8._12_4_ + auVar96._12_4_) * 0.5;
          auVar96 = vshufps_avx(auVar76,auVar76,0);
          fVar209 = auVar96._0_4_;
          fVar190 = auVar96._4_4_;
          fVar211 = auVar96._8_4_;
          fVar191 = auVar96._12_4_;
          auVar156._0_4_ = fVar209 * (float)local_1c8._0_4_ + (float)local_2e8._0_4_;
          auVar156._4_4_ = fVar190 * (float)local_1c8._4_4_ + (float)local_2e8._4_4_;
          auVar156._8_4_ = fVar211 * fStack_1c0 + fStack_2e0;
          auVar156._12_4_ = fVar191 * fStack_1bc + fStack_2dc;
          auVar256._0_4_ = fVar209 * (float)local_1d8._0_4_ + (float)local_2f8._0_4_;
          auVar256._4_4_ = fVar190 * (float)local_1d8._4_4_ + (float)local_2f8._4_4_;
          auVar256._8_4_ = fVar211 * fStack_1d0 + fStack_2f0;
          auVar256._12_4_ = fVar191 * fStack_1cc + fStack_2ec;
          auVar289._0_4_ = fVar209 * (float)local_1e8._0_4_ + (float)local_308._0_4_;
          auVar289._4_4_ = fVar190 * (float)local_1e8._4_4_ + (float)local_308._4_4_;
          auVar289._8_4_ = fVar211 * fStack_1e0 + fStack_300;
          auVar289._12_4_ = fVar191 * fStack_1dc + fStack_2fc;
          auVar96 = vsubps_avx(auVar256,auVar156);
          auVar157._0_4_ = auVar96._0_4_ * fVar209 + auVar156._0_4_;
          auVar157._4_4_ = auVar96._4_4_ * fVar190 + auVar156._4_4_;
          auVar157._8_4_ = auVar96._8_4_ * fVar211 + auVar156._8_4_;
          auVar157._12_4_ = auVar96._12_4_ * fVar191 + auVar156._12_4_;
          auVar96 = vsubps_avx(auVar289,auVar256);
          auVar257._0_4_ = auVar256._0_4_ + auVar96._0_4_ * fVar209;
          auVar257._4_4_ = auVar256._4_4_ + auVar96._4_4_ * fVar190;
          auVar257._8_4_ = auVar256._8_4_ + auVar96._8_4_ * fVar211;
          auVar257._12_4_ = auVar256._12_4_ + auVar96._12_4_ * fVar191;
          auVar96 = vsubps_avx(auVar257,auVar157);
          fVar209 = auVar157._0_4_ + auVar96._0_4_ * fVar209;
          fVar190 = auVar157._4_4_ + auVar96._4_4_ * fVar190;
          auVar117._0_8_ = CONCAT44(fVar190,fVar209);
          auVar117._8_4_ = auVar157._8_4_ + auVar96._8_4_ * fVar211;
          auVar117._12_4_ = auVar157._12_4_ + auVar96._12_4_ * fVar191;
          fVar211 = auVar96._0_4_ * 3.0;
          fVar191 = auVar96._4_4_ * 3.0;
          auVar158._0_8_ = CONCAT44(fVar191,fVar211);
          auVar158._8_4_ = auVar96._8_4_ * 3.0;
          auVar158._12_4_ = auVar96._12_4_ * 3.0;
          auVar258._8_8_ = auVar117._0_8_;
          auVar258._0_8_ = auVar117._0_8_;
          auVar96 = vshufpd_avx(auVar117,auVar117,3);
          auVar177 = vshufps_avx(auVar76,auVar76,0x55);
          auVar94 = vsubps_avx(auVar96,auVar258);
          auVar259._0_4_ = auVar177._0_4_ * auVar94._0_4_ + fVar209;
          auVar259._4_4_ = auVar177._4_4_ * auVar94._4_4_ + fVar190;
          auVar259._8_4_ = auVar177._8_4_ * auVar94._8_4_ + fVar209;
          auVar259._12_4_ = auVar177._12_4_ * auVar94._12_4_ + fVar190;
          auVar303._8_8_ = auVar158._0_8_;
          auVar303._0_8_ = auVar158._0_8_;
          auVar96 = vshufpd_avx(auVar158,auVar158,1);
          auVar96 = vsubps_avx(auVar96,auVar303);
          auVar159._0_4_ = fVar211 + auVar177._0_4_ * auVar96._0_4_;
          auVar159._4_4_ = fVar191 + auVar177._4_4_ * auVar96._4_4_;
          auVar159._8_4_ = fVar211 + auVar177._8_4_ * auVar96._8_4_;
          auVar159._12_4_ = fVar191 + auVar177._12_4_ * auVar96._12_4_;
          auVar177 = vmovshdup_avx(auVar159);
          auVar304._0_8_ = auVar177._0_8_ ^ 0x8000000080000000;
          auVar304._8_4_ = auVar177._8_4_ ^ 0x80000000;
          auVar304._12_4_ = auVar177._12_4_ ^ 0x80000000;
          auVar95 = vmovshdup_avx(auVar94);
          auVar96 = vunpcklps_avx(auVar95,auVar304);
          auVar136 = vshufps_avx(auVar96,auVar304,4);
          auVar118._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
          auVar118._8_4_ = -auVar94._8_4_;
          auVar118._12_4_ = -auVar94._12_4_;
          auVar96 = vmovlhps_avx(auVar118,auVar159);
          auVar103 = vshufps_avx(auVar96,auVar159,8);
          auVar96 = ZEXT416((uint)(auVar95._0_4_ * auVar159._0_4_ - auVar177._0_4_ * auVar94._0_4_))
          ;
          auVar177 = vshufps_avx(auVar96,auVar96,0);
          auVar96 = vdivps_avx(auVar136,auVar177);
          auVar177 = vdivps_avx(auVar103,auVar177);
          auVar103 = vinsertps_avx(auVar183,auVar266,0x1c);
          auVar94 = vinsertps_avx(auVar203,auVar274,0x1c);
          auVar75 = vinsertps_avx(auVar266,auVar183,0x4c);
          auVar310 = vinsertps_avx(auVar274,auVar203,0x4c);
          auVar95 = vmovsldup_avx(auVar96);
          auVar275._0_4_ = auVar95._0_4_ * auVar103._0_4_;
          auVar275._4_4_ = auVar95._4_4_ * auVar103._4_4_;
          auVar275._8_4_ = auVar95._8_4_ * auVar103._8_4_;
          auVar275._12_4_ = auVar95._12_4_ * auVar103._12_4_;
          auVar267._0_4_ = auVar95._0_4_ * auVar94._0_4_;
          auVar267._4_4_ = auVar95._4_4_ * auVar94._4_4_;
          auVar267._8_4_ = auVar95._8_4_ * auVar94._8_4_;
          auVar267._12_4_ = auVar95._12_4_ * auVar94._12_4_;
          auVar136 = vminps_avx(auVar275,auVar267);
          auVar95 = vmaxps_avx(auVar267,auVar275);
          auVar148 = vmovsldup_avx(auVar177);
          auVar319._0_4_ = auVar148._0_4_ * auVar75._0_4_;
          auVar319._4_4_ = auVar148._4_4_ * auVar75._4_4_;
          auVar319._8_4_ = auVar148._8_4_ * auVar75._8_4_;
          auVar319._12_4_ = auVar148._12_4_ * auVar75._12_4_;
          auVar268._0_4_ = auVar148._0_4_ * auVar310._0_4_;
          auVar268._4_4_ = auVar148._4_4_ * auVar310._4_4_;
          auVar268._8_4_ = auVar148._8_4_ * auVar310._8_4_;
          auVar268._12_4_ = auVar148._12_4_ * auVar310._12_4_;
          auVar148 = vminps_avx(auVar319,auVar268);
          auVar98._0_4_ = auVar136._0_4_ + auVar148._0_4_;
          auVar98._4_4_ = auVar136._4_4_ + auVar148._4_4_;
          auVar98._8_4_ = auVar136._8_4_ + auVar148._8_4_;
          auVar98._12_4_ = auVar136._12_4_ + auVar148._12_4_;
          auVar136 = vmaxps_avx(auVar268,auVar319);
          auVar148 = vsubps_avx(auVar225,auVar76);
          auVar6 = vsubps_avx(auVar243,auVar76);
          auVar244._0_4_ = auVar95._0_4_ + auVar136._0_4_;
          auVar244._4_4_ = auVar95._4_4_ + auVar136._4_4_;
          auVar244._8_4_ = auVar95._8_4_ + auVar136._8_4_;
          auVar244._12_4_ = auVar95._12_4_ + auVar136._12_4_;
          auVar276._8_8_ = 0x3f800000;
          auVar276._0_8_ = 0x3f800000;
          auVar95 = vsubps_avx(auVar276,auVar244);
          auVar136 = vsubps_avx(auVar276,auVar98);
          fVar214 = auVar148._0_4_;
          auVar277._0_4_ = fVar214 * auVar95._0_4_;
          fVar193 = auVar148._4_4_;
          auVar277._4_4_ = fVar193 * auVar95._4_4_;
          fVar215 = auVar148._8_4_;
          auVar277._8_4_ = fVar215 * auVar95._8_4_;
          fVar194 = auVar148._12_4_;
          auVar277._12_4_ = fVar194 * auVar95._12_4_;
          fVar211 = auVar6._0_4_;
          auVar245._0_4_ = auVar95._0_4_ * fVar211;
          fVar191 = auVar6._4_4_;
          auVar245._4_4_ = auVar95._4_4_ * fVar191;
          fVar212 = auVar6._8_4_;
          auVar245._8_4_ = auVar95._8_4_ * fVar212;
          fVar192 = auVar6._12_4_;
          auVar245._12_4_ = auVar95._12_4_ * fVar192;
          auVar311._0_4_ = fVar214 * auVar136._0_4_;
          auVar311._4_4_ = fVar193 * auVar136._4_4_;
          auVar311._8_4_ = fVar215 * auVar136._8_4_;
          auVar311._12_4_ = fVar194 * auVar136._12_4_;
          auVar99._0_4_ = fVar211 * auVar136._0_4_;
          auVar99._4_4_ = fVar191 * auVar136._4_4_;
          auVar99._8_4_ = fVar212 * auVar136._8_4_;
          auVar99._12_4_ = fVar192 * auVar136._12_4_;
          auVar95 = vminps_avx(auVar277,auVar311);
          auVar136 = vminps_avx(auVar245,auVar99);
          auVar148 = vminps_avx(auVar95,auVar136);
          auVar95 = vmaxps_avx(auVar311,auVar277);
          auVar136 = vmaxps_avx(auVar99,auVar245);
          auVar6 = vshufps_avx(auVar76,auVar76,0x54);
          auVar136 = vmaxps_avx(auVar136,auVar95);
          auVar7 = vshufps_avx(auVar259,auVar259,0);
          auVar223 = vshufps_avx(auVar259,auVar259,0x55);
          auVar95 = vhaddps_avx(auVar148,auVar148);
          auVar136 = vhaddps_avx(auVar136,auVar136);
          auVar246._0_4_ = auVar7._0_4_ * auVar96._0_4_ + auVar223._0_4_ * auVar177._0_4_;
          auVar246._4_4_ = auVar7._4_4_ * auVar96._4_4_ + auVar223._4_4_ * auVar177._4_4_;
          auVar246._8_4_ = auVar7._8_4_ * auVar96._8_4_ + auVar223._8_4_ * auVar177._8_4_;
          auVar246._12_4_ = auVar7._12_4_ * auVar96._12_4_ + auVar223._12_4_ * auVar177._12_4_;
          auVar148 = vsubps_avx(auVar6,auVar246);
          fVar209 = auVar148._0_4_ + auVar95._0_4_;
          fVar190 = auVar148._0_4_ + auVar136._0_4_;
          auVar95 = vmaxss_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar209));
          auVar136 = vminss_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar172));
          if (auVar95._0_4_ <= auVar136._0_4_) {
            auVar95 = vmovshdup_avx(auVar96);
            auVar133._0_4_ = auVar103._0_4_ * auVar95._0_4_;
            auVar133._4_4_ = auVar103._4_4_ * auVar95._4_4_;
            auVar133._8_4_ = auVar103._8_4_ * auVar95._8_4_;
            auVar133._12_4_ = auVar103._12_4_ * auVar95._12_4_;
            auVar100._0_4_ = auVar94._0_4_ * auVar95._0_4_;
            auVar100._4_4_ = auVar94._4_4_ * auVar95._4_4_;
            auVar100._8_4_ = auVar94._8_4_ * auVar95._8_4_;
            auVar100._12_4_ = auVar94._12_4_ * auVar95._12_4_;
            auVar136 = vminps_avx(auVar133,auVar100);
            auVar95 = vmaxps_avx(auVar100,auVar133);
            auVar103 = vmovshdup_avx(auVar177);
            auVar184._0_4_ = auVar103._0_4_ * auVar75._0_4_;
            auVar184._4_4_ = auVar103._4_4_ * auVar75._4_4_;
            auVar184._8_4_ = auVar103._8_4_ * auVar75._8_4_;
            auVar184._12_4_ = auVar103._12_4_ * auVar75._12_4_;
            auVar134._0_4_ = auVar103._0_4_ * auVar310._0_4_;
            auVar134._4_4_ = auVar103._4_4_ * auVar310._4_4_;
            auVar134._8_4_ = auVar103._8_4_ * auVar310._8_4_;
            auVar134._12_4_ = auVar103._12_4_ * auVar310._12_4_;
            auVar103 = vminps_avx(auVar184,auVar134);
            auVar204._0_4_ = auVar136._0_4_ + auVar103._0_4_;
            auVar204._4_4_ = auVar136._4_4_ + auVar103._4_4_;
            auVar204._8_4_ = auVar136._8_4_ + auVar103._8_4_;
            auVar204._12_4_ = auVar136._12_4_ + auVar103._12_4_;
            auVar136 = vmaxps_avx(auVar134,auVar184);
            auVar101._0_4_ = auVar95._0_4_ + auVar136._0_4_;
            auVar101._4_4_ = auVar95._4_4_ + auVar136._4_4_;
            auVar101._8_4_ = auVar95._8_4_ + auVar136._8_4_;
            auVar101._12_4_ = auVar95._12_4_ + auVar136._12_4_;
            auVar95 = vsubps_avx(_local_478,auVar101);
            auVar136 = vsubps_avx(_local_478,auVar204);
            auVar185._0_4_ = fVar214 * auVar95._0_4_;
            auVar185._4_4_ = fVar193 * auVar95._4_4_;
            auVar185._8_4_ = fVar215 * auVar95._8_4_;
            auVar185._12_4_ = fVar194 * auVar95._12_4_;
            auVar205._0_4_ = fVar214 * auVar136._0_4_;
            auVar205._4_4_ = fVar193 * auVar136._4_4_;
            auVar205._8_4_ = fVar215 * auVar136._8_4_;
            auVar205._12_4_ = fVar194 * auVar136._12_4_;
            auVar102._0_4_ = fVar211 * auVar95._0_4_;
            auVar102._4_4_ = fVar191 * auVar95._4_4_;
            auVar102._8_4_ = fVar212 * auVar95._8_4_;
            auVar102._12_4_ = fVar192 * auVar95._12_4_;
            auVar135._0_4_ = fVar211 * auVar136._0_4_;
            auVar135._4_4_ = fVar191 * auVar136._4_4_;
            auVar135._8_4_ = fVar212 * auVar136._8_4_;
            auVar135._12_4_ = fVar192 * auVar136._12_4_;
            auVar95 = vminps_avx(auVar185,auVar205);
            auVar136 = vminps_avx(auVar102,auVar135);
            auVar95 = vminps_avx(auVar95,auVar136);
            auVar136 = vmaxps_avx(auVar205,auVar185);
            auVar103 = vmaxps_avx(auVar135,auVar102);
            auVar95 = vhaddps_avx(auVar95,auVar95);
            auVar136 = vmaxps_avx(auVar103,auVar136);
            auVar136 = vhaddps_avx(auVar136,auVar136);
            auVar103 = vmovshdup_avx(auVar148);
            auVar94 = ZEXT416((uint)(auVar103._0_4_ + auVar95._0_4_));
            auVar95 = vmaxss_avx(local_4d8,auVar94);
            auVar103 = ZEXT416((uint)(auVar103._0_4_ + auVar136._0_4_));
            auVar136 = vminss_avx(auVar103,_local_458);
            if (auVar95._0_4_ <= auVar136._0_4_) {
              uVar64 = 0;
              auVar313 = ZEXT864(0) << 0x20;
              auVar320._8_4_ = 0x3f800000;
              auVar320._0_8_ = &DAT_3f8000003f800000;
              auVar320._12_4_ = 0x3f800000;
              if (fVar209 <= fVar189) {
                auVar247._8_4_ = 0x7fffffff;
                auVar247._0_8_ = 0x7fffffff7fffffff;
                auVar247._12_4_ = 0x7fffffff;
              }
              else {
                auVar247._8_4_ = 0x7fffffff;
                auVar247._0_8_ = 0x7fffffff7fffffff;
                auVar247._12_4_ = 0x7fffffff;
                if (fVar190 < fVar172) {
                  auVar95 = vcmpps_avx(auVar103,_local_458,1);
                  auVar136 = vcmpps_avx(local_4d8,auVar94,1);
                  auVar95 = vandps_avx(auVar136,auVar95);
                  uVar64 = auVar95._0_4_;
                }
              }
              if (((uint)uVar68 < 4 && 0.001 <= fVar195) && (uVar64 & 1) == 0) {
                bVar60 = false;
              }
              else {
                lVar67 = 200;
                do {
                  fVar195 = auVar148._0_4_;
                  fVar172 = 1.0 - fVar195;
                  auVar95 = ZEXT416((uint)(fVar172 * fVar172 * fVar172));
                  auVar95 = vshufps_avx(auVar95,auVar95,0);
                  auVar136 = ZEXT416((uint)(fVar195 * 3.0 * fVar172 * fVar172));
                  auVar136 = vshufps_avx(auVar136,auVar136,0);
                  auVar103 = ZEXT416((uint)(fVar172 * fVar195 * fVar195 * 3.0));
                  auVar103 = vshufps_avx(auVar103,auVar103,0);
                  auVar94 = ZEXT416((uint)(fVar195 * fVar195 * fVar195));
                  auVar94 = vshufps_avx(auVar94,auVar94,0);
                  fVar172 = (float)local_2e8._0_4_ * auVar95._0_4_ +
                            (float)local_2f8._0_4_ * auVar136._0_4_ +
                            auVar94._0_4_ * (float)local_498._0_4_ +
                            (float)local_308._0_4_ * auVar103._0_4_;
                  fVar195 = (float)local_2e8._4_4_ * auVar95._4_4_ +
                            (float)local_2f8._4_4_ * auVar136._4_4_ +
                            auVar94._4_4_ * (float)local_498._4_4_ +
                            (float)local_308._4_4_ * auVar103._4_4_;
                  auVar104._0_8_ = CONCAT44(fVar195,fVar172);
                  auVar104._8_4_ =
                       fStack_2e0 * auVar95._8_4_ +
                       fStack_2f0 * auVar136._8_4_ +
                       auVar94._8_4_ * fStack_490 + fStack_300 * auVar103._8_4_;
                  auVar104._12_4_ =
                       fStack_2dc * auVar95._12_4_ +
                       fStack_2ec * auVar136._12_4_ +
                       auVar94._12_4_ * fStack_48c + fStack_2fc * auVar103._12_4_;
                  auVar137._8_8_ = auVar104._0_8_;
                  auVar137._0_8_ = auVar104._0_8_;
                  auVar136 = vshufpd_avx(auVar104,auVar104,1);
                  auVar95 = vmovshdup_avx(auVar148);
                  auVar136 = vsubps_avx(auVar136,auVar137);
                  auVar105._0_4_ = auVar95._0_4_ * auVar136._0_4_ + fVar172;
                  auVar105._4_4_ = auVar95._4_4_ * auVar136._4_4_ + fVar195;
                  auVar105._8_4_ = auVar95._8_4_ * auVar136._8_4_ + fVar172;
                  auVar105._12_4_ = auVar95._12_4_ * auVar136._12_4_ + fVar195;
                  auVar95 = vshufps_avx(auVar105,auVar105,0);
                  auVar136 = vshufps_avx(auVar105,auVar105,0x55);
                  auVar138._0_4_ = auVar96._0_4_ * auVar95._0_4_ + auVar177._0_4_ * auVar136._0_4_;
                  auVar138._4_4_ = auVar96._4_4_ * auVar95._4_4_ + auVar177._4_4_ * auVar136._4_4_;
                  auVar138._8_4_ = auVar96._8_4_ * auVar95._8_4_ + auVar177._8_4_ * auVar136._8_4_;
                  auVar138._12_4_ =
                       auVar96._12_4_ * auVar95._12_4_ + auVar177._12_4_ * auVar136._12_4_;
                  auVar148 = vsubps_avx(auVar148,auVar138);
                  auVar95 = vandps_avx(auVar247,auVar105);
                  auVar136 = vshufps_avx(auVar95,auVar95,0xf5);
                  auVar95 = vmaxss_avx(auVar136,auVar95);
                  if (auVar95._0_4_ < (float)local_4a8._0_4_) {
                    fVar172 = auVar148._0_4_;
                    if ((0.0 <= fVar172) && (fVar172 <= 1.0)) {
                      auVar96 = vmovshdup_avx(auVar148);
                      fVar195 = auVar96._0_4_;
                      if ((0.0 <= fVar195) && (fVar195 <= 1.0)) {
                        auVar96 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar310 = vinsertps_avx(auVar96,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                       m128[2]),0x28);
                        aVar5 = (ray->super_RayK<1>).org.field_0;
                        auVar96 = vsubps_avx(_local_398,(undefined1  [16])aVar5);
                        auVar96 = vdpps_avx(auVar96,auVar310,0x7f);
                        auVar177 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
                        auVar177 = vdpps_avx(auVar177,auVar310,0x7f);
                        auVar95 = vsubps_avx(_local_3e8,(undefined1  [16])aVar5);
                        auVar95 = vdpps_avx(auVar95,auVar310,0x7f);
                        auVar136 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
                        auVar136 = vdpps_avx(auVar136,auVar310,0x7f);
                        auVar103 = vsubps_avx(_local_3a8,(undefined1  [16])aVar5);
                        auVar103 = vdpps_avx(auVar103,auVar310,0x7f);
                        auVar94 = vsubps_avx(_local_3f8,(undefined1  [16])aVar5);
                        auVar94 = vdpps_avx(auVar94,auVar310,0x7f);
                        auVar75 = vsubps_avx(_local_2a8,(undefined1  [16])aVar5);
                        auVar75 = vdpps_avx(auVar75,auVar310,0x7f);
                        auVar6 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
                        auVar310 = vdpps_avx(auVar6,auVar310,0x7f);
                        fVar191 = 1.0 - fVar195;
                        fVar212 = 1.0 - fVar172;
                        fVar189 = auVar148._4_4_;
                        fVar209 = auVar148._8_4_;
                        fVar190 = auVar148._12_4_;
                        fVar211 = fVar212 * fVar172 * fVar172 * 3.0;
                        auVar186._0_4_ = fVar172 * fVar172 * fVar172;
                        auVar186._4_4_ = fVar189 * fVar189 * fVar189;
                        auVar186._8_4_ = fVar209 * fVar209 * fVar209;
                        auVar186._12_4_ = fVar190 * fVar190 * fVar190;
                        fVar189 = fVar172 * 3.0 * fVar212 * fVar212;
                        fVar209 = fVar212 * fVar212 * fVar212;
                        fVar172 = (fVar191 * auVar96._0_4_ + auVar103._0_4_ * fVar195) * fVar209 +
                                  fVar189 * (auVar94._0_4_ * fVar195 + fVar191 * auVar177._0_4_) +
                                  fVar211 * (auVar75._0_4_ * fVar195 + fVar191 * auVar95._0_4_) +
                                  auVar186._0_4_ *
                                  (fVar191 * auVar136._0_4_ + fVar195 * auVar310._0_4_);
                        if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar172) &&
                            (fVar195 = (ray->super_RayK<1>).tfar, fVar172 <= fVar195)) &&
                           (pGVar9 = (context->scene->geometries).items[uVar63].ptr,
                           (pGVar9->mask & (ray->super_RayK<1>).mask) != 0)) {
                          local_458._0_4_ = fVar195;
                          auVar96 = vshufps_avx(auVar148,auVar148,0x55);
                          auVar177 = vsubps_avx(auVar320,auVar96);
                          fVar195 = auVar96._0_4_;
                          fVar190 = auVar96._4_4_;
                          fVar191 = auVar96._8_4_;
                          fVar192 = auVar96._12_4_;
                          fVar214 = auVar177._0_4_;
                          fVar193 = auVar177._4_4_;
                          fVar215 = auVar177._8_4_;
                          fVar194 = auVar177._12_4_;
                          auVar260._0_4_ =
                               fVar195 * (float)local_3a8._0_4_ + fVar214 * (float)local_398._0_4_;
                          auVar260._4_4_ =
                               fVar190 * (float)local_3a8._4_4_ + fVar193 * (float)local_398._4_4_;
                          auVar260._8_4_ = fVar191 * fStack_3a0 + fVar215 * fStack_390;
                          auVar260._12_4_ = fVar192 * fStack_39c + fVar194 * fStack_38c;
                          auVar269._0_4_ =
                               fVar195 * (float)local_3f8._0_4_ + fVar214 * (float)local_3d8._0_4_;
                          auVar269._4_4_ =
                               fVar190 * (float)local_3f8._4_4_ + fVar193 * (float)local_3d8._4_4_;
                          auVar269._8_4_ = fVar191 * fStack_3f0 + fVar215 * fStack_3d0;
                          auVar269._12_4_ = fVar192 * fStack_3ec + fVar194 * fStack_3cc;
                          auVar278._0_4_ =
                               fVar195 * (float)local_2a8._0_4_ + fVar214 * (float)local_3e8._0_4_;
                          auVar278._4_4_ =
                               fVar190 * (float)local_2a8._4_4_ + fVar193 * (float)local_3e8._4_4_;
                          auVar278._8_4_ = fVar191 * fStack_2a0 + fVar215 * fStack_3e0;
                          auVar278._12_4_ = fVar192 * fStack_29c + fVar194 * fStack_3dc;
                          auVar226._0_4_ =
                               fVar214 * (float)local_3b8._0_4_ + fVar195 * (float)local_3c8._0_4_;
                          auVar226._4_4_ =
                               fVar193 * (float)local_3b8._4_4_ + fVar190 * (float)local_3c8._4_4_;
                          auVar226._8_4_ = fVar215 * fStack_3b0 + fVar191 * fStack_3c0;
                          auVar226._12_4_ = fVar194 * fStack_3ac + fVar192 * fStack_3bc;
                          auVar136 = vsubps_avx(auVar269,auVar260);
                          auVar103 = vsubps_avx(auVar278,auVar269);
                          auVar94 = vsubps_avx(auVar226,auVar278);
                          auVar96 = vshufps_avx(auVar148,auVar148,0);
                          fVar192 = auVar96._0_4_;
                          fVar214 = auVar96._4_4_;
                          fVar193 = auVar96._8_4_;
                          fVar215 = auVar96._12_4_;
                          auVar96 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
                          fVar195 = auVar96._0_4_;
                          fVar190 = auVar96._4_4_;
                          fVar191 = auVar96._8_4_;
                          fVar212 = auVar96._12_4_;
                          auVar96 = vshufps_avx(auVar186,auVar186,0);
                          auVar177 = vshufps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),0);
                          auVar95 = vshufps_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),0);
                          auVar160._0_4_ =
                               ((auVar136._0_4_ * fVar195 + fVar192 * auVar103._0_4_) * fVar195 +
                               fVar192 * (auVar103._0_4_ * fVar195 + fVar192 * auVar94._0_4_)) * 3.0
                          ;
                          auVar160._4_4_ =
                               ((auVar136._4_4_ * fVar190 + fVar214 * auVar103._4_4_) * fVar190 +
                               fVar214 * (auVar103._4_4_ * fVar190 + fVar214 * auVar94._4_4_)) * 3.0
                          ;
                          auVar160._8_4_ =
                               ((auVar136._8_4_ * fVar191 + fVar193 * auVar103._8_4_) * fVar191 +
                               fVar193 * (auVar103._8_4_ * fVar191 + fVar193 * auVar94._8_4_)) * 3.0
                          ;
                          auVar160._12_4_ =
                               ((auVar136._12_4_ * fVar212 + fVar215 * auVar103._12_4_) * fVar212 +
                               fVar215 * (auVar103._12_4_ * fVar212 + fVar215 * auVar94._12_4_)) *
                               3.0;
                          auVar136 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
                          auVar119._0_4_ =
                               auVar136._0_4_ * (float)local_208._0_4_ +
                               auVar95._0_4_ * (float)local_218._0_4_ +
                               auVar96._0_4_ * (float)local_238._0_4_ +
                               auVar177._0_4_ * (float)local_228._0_4_;
                          auVar119._4_4_ =
                               auVar136._4_4_ * (float)local_208._4_4_ +
                               auVar95._4_4_ * (float)local_218._4_4_ +
                               auVar96._4_4_ * (float)local_238._4_4_ +
                               auVar177._4_4_ * (float)local_228._4_4_;
                          auVar119._8_4_ =
                               auVar136._8_4_ * fStack_200 +
                               auVar95._8_4_ * fStack_210 +
                               auVar96._8_4_ * fStack_230 + auVar177._8_4_ * fStack_220;
                          auVar119._12_4_ =
                               auVar136._12_4_ * fStack_1fc +
                               auVar95._12_4_ * fStack_20c +
                               auVar96._12_4_ * fStack_22c + auVar177._12_4_ * fStack_21c;
                          auVar96 = vshufps_avx(auVar160,auVar160,0xc9);
                          auVar139._0_4_ = auVar119._0_4_ * auVar96._0_4_;
                          auVar139._4_4_ = auVar119._4_4_ * auVar96._4_4_;
                          auVar139._8_4_ = auVar119._8_4_ * auVar96._8_4_;
                          auVar139._12_4_ = auVar119._12_4_ * auVar96._12_4_;
                          auVar96 = vshufps_avx(auVar119,auVar119,0xc9);
                          auVar120._0_4_ = auVar160._0_4_ * auVar96._0_4_;
                          auVar120._4_4_ = auVar160._4_4_ * auVar96._4_4_;
                          auVar120._8_4_ = auVar160._8_4_ * auVar96._8_4_;
                          auVar120._12_4_ = auVar160._12_4_ * auVar96._12_4_;
                          auVar96 = vsubps_avx(auVar120,auVar139);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar172;
                            auVar177 = vshufps_avx(auVar96,auVar96,0xe9);
                            uVar3 = vmovlps_avx(auVar177);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar3;
                            (ray->Ng).field_0.field_0.z = auVar96._0_4_;
                            uVar3 = vmovlps_avx(auVar148);
                            ray->u = (float)(int)uVar3;
                            ray->v = (float)(int)((ulong)uVar3 >> 0x20);
                            ray->primID = (uint)local_480;
                            ray->geomID = uVar63;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar177 = vshufps_avx(auVar96,auVar96,0xe9);
                            local_268 = vmovlps_avx(auVar177);
                            local_260 = auVar96._0_4_;
                            local_25c = vmovlps_avx(auVar148);
                            local_254 = (uint)local_480;
                            local_250 = uVar63;
                            local_24c = context->user->instID[0];
                            local_248 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar172;
                            local_4ac = -1;
                            local_2d8.valid = &local_4ac;
                            local_2d8.geometryUserPtr = pGVar9->userPtr;
                            local_2d8.context = context->user;
                            local_2d8.ray = (RTCRayN *)ray;
                            local_2d8.hit = (RTCHitN *)&local_268;
                            local_2d8.N = 1;
                            local_438 = auVar77;
                            if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0110ab6b:
                              p_Var10 = context->args->filter;
                              if (p_Var10 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var10)(&local_2d8);
                                  auVar313 = ZEXT1664(ZEXT816(0) << 0x40);
                                }
                                if (*local_2d8.valid == 0) goto LAB_0110ac12;
                              }
                              (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_2d8.hit;
                              (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2d8.hit + 4);
                              (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2d8.hit + 8);
                              *(float *)((long)local_2d8.ray + 0x3c) =
                                   *(float *)(local_2d8.hit + 0xc);
                              *(float *)((long)local_2d8.ray + 0x40) =
                                   *(float *)(local_2d8.hit + 0x10);
                              *(float *)((long)local_2d8.ray + 0x44) =
                                   *(float *)(local_2d8.hit + 0x14);
                              *(float *)((long)local_2d8.ray + 0x48) =
                                   *(float *)(local_2d8.hit + 0x18);
                              *(float *)((long)local_2d8.ray + 0x4c) =
                                   *(float *)(local_2d8.hit + 0x1c);
                              *(float *)((long)local_2d8.ray + 0x50) =
                                   *(float *)(local_2d8.hit + 0x20);
                            }
                            else {
                              (*pGVar9->intersectionFilterN)(&local_2d8);
                              auVar313 = ZEXT1664(ZEXT816(0) << 0x40);
                              if (*local_2d8.valid != 0) goto LAB_0110ab6b;
LAB_0110ac12:
                              (ray->super_RayK<1>).tfar = (float)local_458._0_4_;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar67 = lVar67 + -1;
                } while (lVar67 != 0);
              }
              goto LAB_0110aa64;
            }
          }
          goto LAB_0110aa79;
        }
      }
LAB_0110aa64:
    } while (bVar60);
    local_1f8 = vinsertps_avx(local_438._0_16_,ZEXT416((uint)local_418._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }